

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  uint uVar56;
  ulong uVar57;
  ulong uVar58;
  byte bVar60;
  uint uVar61;
  ulong uVar62;
  uint uVar63;
  undefined4 uVar64;
  undefined8 unaff_RBP;
  long lVar65;
  bool bVar66;
  long lVar67;
  float fVar68;
  float fVar90;
  vint4 bi_2;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar91;
  undefined8 uVar92;
  vint4 bi_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar139;
  float fVar142;
  float fVar163;
  float fVar164;
  vint4 ai_2;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar165;
  undefined1 auVar149 [16];
  float fVar140;
  undefined1 auVar150 [16];
  float fVar141;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vint4 bi;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  vint4 ai;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  vint4 ai_1;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  float fVar212;
  float fVar227;
  float fVar229;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar231;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar233;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar228;
  float fVar230;
  float fVar232;
  undefined1 auVar226 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar242;
  float fVar257;
  float fVar258;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar259;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  float fVar260;
  float fVar275;
  float fVar276;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar277;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar293 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar287;
  float fVar300;
  float fVar301;
  undefined1 auVar288 [16];
  float fVar302;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  __m128 a;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar325 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_548;
  float fStack_544;
  float fStack_540;
  undefined1 local_538 [8];
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  int local_4ec;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [8];
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_440;
  ulong local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 auStack_418 [16];
  undefined1 local_408 [32];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 auStack_398 [16];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  ulong local_308;
  Primitive *local_300;
  RTCFilterFunctionNArguments local_2f8;
  uint local_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  undefined1 local_2b8 [16];
  uint auStack_2a8 [4];
  undefined8 local_298;
  undefined4 local_290;
  undefined8 local_28c;
  undefined4 local_284;
  undefined4 local_280;
  uint local_27c;
  uint local_278;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  uint uStack_1d8;
  float afStack_1d4 [7];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  ulong uVar59;
  undefined1 auVar324 [32];
  
  PVar8 = prim[1];
  uVar57 = (ulong)(byte)PVar8;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 4 + 6)));
  lVar67 = uVar57 * 0x25;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 5 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 6 + 6)));
  auVar293 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xf + 6)));
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x11 + 6)));
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x1a + 6)));
  auVar171 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x1b + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x1c + 6)));
  fVar68 = *(float *)(prim + lVar67 + 0x12);
  auVar266 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar67 + 6));
  fVar91 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar67 + 0x16)) *
           *(float *)(prim + lVar67 + 0x1a);
  auVar261._0_4_ = fVar68 * auVar266._0_4_;
  auVar261._4_4_ = fVar68 * auVar266._4_4_;
  auVar261._8_4_ = fVar68 * auVar266._8_4_;
  auVar261._12_4_ = fVar68 * auVar266._12_4_;
  auVar303._0_4_ = fVar68 * (ray->dir).field_0.m128[0];
  auVar303._4_4_ = fVar68 * (ray->dir).field_0.m128[1];
  auVar303._8_4_ = fVar68 * (ray->dir).field_0.m128[2];
  auVar303._12_4_ = fVar68 * (ray->dir).field_0.m128[3];
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar266 = vshufps_avx(auVar303,auVar303,0x55);
  auVar282 = vshufps_avx(auVar303,auVar303,0xaa);
  fVar68 = auVar282._0_4_;
  auVar278._0_4_ = fVar68 * auVar19._0_4_;
  fVar142 = auVar282._4_4_;
  auVar278._4_4_ = fVar142 * auVar19._4_4_;
  fVar141 = auVar282._8_4_;
  auVar278._8_4_ = fVar141 * auVar19._8_4_;
  fVar90 = auVar282._12_4_;
  auVar278._12_4_ = fVar90 * auVar19._12_4_;
  auVar243._0_4_ = fVar68 * auVar20._0_4_;
  auVar243._4_4_ = fVar142 * auVar20._4_4_;
  auVar243._8_4_ = fVar141 * auVar20._8_4_;
  auVar243._12_4_ = fVar90 * auVar20._12_4_;
  auVar234._0_4_ = fVar68 * auVar21._0_4_;
  auVar234._4_4_ = fVar142 * auVar21._4_4_;
  auVar234._8_4_ = fVar141 * auVar21._8_4_;
  auVar234._12_4_ = fVar90 * auVar21._12_4_;
  auVar69 = vfmadd231ps_fma(auVar278,auVar266,auVar18);
  auVar154 = vfmadd231ps_fma(auVar243,auVar266,auVar157);
  auVar94 = vfmadd231ps_fma(auVar234,auVar171,auVar266);
  auVar266 = vshufps_avx(auVar261,auVar261,0xaa);
  fVar68 = auVar266._0_4_;
  auVar166._0_4_ = fVar68 * auVar19._0_4_;
  fVar142 = auVar266._4_4_;
  auVar166._4_4_ = fVar142 * auVar19._4_4_;
  fVar141 = auVar266._8_4_;
  auVar166._8_4_ = fVar141 * auVar19._8_4_;
  fVar90 = auVar266._12_4_;
  auVar166._12_4_ = fVar90 * auVar19._12_4_;
  auVar143._0_4_ = fVar68 * auVar20._0_4_;
  auVar143._4_4_ = fVar142 * auVar20._4_4_;
  auVar143._8_4_ = fVar141 * auVar20._8_4_;
  auVar143._12_4_ = fVar90 * auVar20._12_4_;
  auVar122._0_4_ = fVar68 * auVar21._0_4_;
  auVar122._4_4_ = fVar142 * auVar21._4_4_;
  auVar122._8_4_ = fVar141 * auVar21._8_4_;
  auVar122._12_4_ = fVar90 * auVar21._12_4_;
  auVar19 = vshufps_avx(auVar261,auVar261,0x55);
  auVar21 = vfmadd231ps_fma(auVar166,auVar19,auVar18);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar57 * 7 + 6);
  auVar266 = vpmovsxwd_avx(auVar18);
  auVar95 = vfmadd231ps_fma(auVar143,auVar19,auVar157);
  auVar122 = vfmadd231ps_fma(auVar122,auVar19,auVar171);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar57 * 0xb + 6);
  auVar282 = vpmovsxwd_avx(auVar19);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar57 * 9 + 6);
  auVar101 = vpmovsxwd_avx(auVar157);
  auVar18 = vcvtdq2ps_avx(auVar17);
  auVar19 = vcvtdq2ps_avx(auVar293);
  auVar157 = vcvtdq2ps_avx(auVar168);
  auVar304._4_4_ = auVar303._0_4_;
  auVar304._0_4_ = auVar303._0_4_;
  auVar304._8_4_ = auVar303._0_4_;
  auVar304._12_4_ = auVar303._0_4_;
  auVar17 = vfmadd231ps_fma(auVar69,auVar304,auVar18);
  auVar293 = vfmadd231ps_fma(auVar154,auVar304,auVar19);
  auVar154 = vfmadd231ps_fma(auVar94,auVar157,auVar304);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar57 * 0xd + 6);
  auVar168 = vpmovsxwd_avx(auVar20);
  auVar262._4_4_ = auVar261._0_4_;
  auVar262._0_4_ = auVar261._0_4_;
  auVar262._8_4_ = auVar261._0_4_;
  auVar262._12_4_ = auVar261._0_4_;
  auVar123 = vfmadd231ps_fma(auVar21,auVar262,auVar18);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar57 * 0x12 + 6);
  auVar69 = vpmovsxwd_avx(auVar171);
  auVar95 = vfmadd231ps_fma(auVar95,auVar262,auVar19);
  auVar122 = vfmadd231ps_fma(auVar122,auVar262,auVar157);
  local_2b8._8_4_ = 0x7fffffff;
  local_2b8._0_8_ = 0x7fffffff7fffffff;
  local_2b8._12_4_ = 0x7fffffff;
  auVar18 = vandps_avx(auVar17,local_2b8);
  auVar263._8_4_ = 0x219392ef;
  auVar263._0_8_ = 0x219392ef219392ef;
  auVar263._12_4_ = 0x219392ef;
  auVar18 = vcmpps_avx(auVar18,auVar263,1);
  auVar19 = vblendvps_avx(auVar17,auVar263,auVar18);
  auVar18 = vandps_avx(auVar293,local_2b8);
  auVar18 = vcmpps_avx(auVar18,auVar263,1);
  auVar157 = vblendvps_avx(auVar293,auVar263,auVar18);
  auVar18 = vandps_avx(auVar154,local_2b8);
  auVar18 = vcmpps_avx(auVar18,auVar263,1);
  auVar18 = vblendvps_avx(auVar154,auVar263,auVar18);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar57 * 0x16 + 6);
  auVar21 = vpmovsxwd_avx(auVar21);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar57 * 0x14 + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar279._4_4_ = fVar91;
  auVar279._0_4_ = fVar91;
  auVar279._8_4_ = fVar91;
  auVar279._12_4_ = fVar91;
  auVar20 = vcvtdq2ps_avx(auVar266);
  auVar171 = vcvtdq2ps_avx(auVar282);
  auVar171 = vsubps_avx(auVar171,auVar20);
  auVar154 = vfmadd213ps_fma(auVar171,auVar279,auVar20);
  auVar293._8_8_ = 0;
  auVar293._0_8_ = *(ulong *)(prim + uVar57 * 0x18 + 6);
  auVar293 = vpmovsxwd_avx(auVar293);
  auVar20 = vcvtdq2ps_avx(auVar101);
  auVar171 = vcvtdq2ps_avx(auVar168);
  auVar171 = vsubps_avx(auVar171,auVar20);
  auVar94 = vfmadd213ps_fma(auVar171,auVar279,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar69);
  auVar171 = vcvtdq2ps_avx(auVar21);
  auVar171 = vsubps_avx(auVar171,auVar20);
  auVar21 = vfmadd213ps_fma(auVar171,auVar279,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar17);
  auVar171 = vcvtdq2ps_avx(auVar293);
  auVar171 = vsubps_avx(auVar171,auVar20);
  auVar17 = vfmadd213ps_fma(auVar171,auVar279,auVar20);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar57 * 0x1d + 6);
  auVar20 = vpmovsxwd_avx(auVar168);
  auVar266._8_8_ = 0;
  auVar266._0_8_ = *(ulong *)(prim + uVar57 * 0x21 + 6);
  auVar171 = vpmovsxwd_avx(auVar266);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar171 = vsubps_avx(auVar171,auVar20);
  auVar293 = vfmadd213ps_fma(auVar171,auVar279,auVar20);
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *(ulong *)(prim + uVar57 * 0x1f + 6);
  auVar20 = vpmovsxwd_avx(auVar282);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar57 * 0x23 + 6);
  auVar171 = vpmovsxwd_avx(auVar101);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar171 = vsubps_avx(auVar171,auVar20);
  auVar171 = vfmadd213ps_fma(auVar171,auVar279,auVar20);
  auVar20 = vrcpps_avx(auVar19);
  auVar93._8_4_ = 0x3f800000;
  auVar93._0_8_ = 0x3f8000003f800000;
  auVar93._12_4_ = 0x3f800000;
  auVar19 = vfnmadd213ps_fma(auVar19,auVar20,auVar93);
  auVar20 = vfmadd132ps_fma(auVar19,auVar20,auVar20);
  auVar19 = vrcpps_avx(auVar157);
  auVar157 = vfnmadd213ps_fma(auVar157,auVar19,auVar93);
  auVar157 = vfmadd132ps_fma(auVar157,auVar19,auVar19);
  auVar19 = vrcpps_avx(auVar18);
  auVar18 = vfnmadd213ps_fma(auVar18,auVar19,auVar93);
  auVar19 = vfmadd132ps_fma(auVar18,auVar19,auVar19);
  auVar18 = vsubps_avx(auVar154,auVar123);
  auVar183._0_4_ = auVar20._0_4_ * auVar18._0_4_;
  auVar183._4_4_ = auVar20._4_4_ * auVar18._4_4_;
  auVar183._8_4_ = auVar20._8_4_ * auVar18._8_4_;
  auVar183._12_4_ = auVar20._12_4_ * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar94,auVar123);
  auVar167._0_4_ = auVar20._0_4_ * auVar18._0_4_;
  auVar167._4_4_ = auVar20._4_4_ * auVar18._4_4_;
  auVar167._8_4_ = auVar20._8_4_ * auVar18._8_4_;
  auVar167._12_4_ = auVar20._12_4_ * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar21,auVar95);
  auVar197._0_4_ = auVar157._0_4_ * auVar18._0_4_;
  auVar197._4_4_ = auVar157._4_4_ * auVar18._4_4_;
  auVar197._8_4_ = auVar157._8_4_ * auVar18._8_4_;
  auVar197._12_4_ = auVar157._12_4_ * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar17,auVar95);
  auVar94._0_4_ = auVar157._0_4_ * auVar18._0_4_;
  auVar94._4_4_ = auVar157._4_4_ * auVar18._4_4_;
  auVar94._8_4_ = auVar157._8_4_ * auVar18._8_4_;
  auVar94._12_4_ = auVar157._12_4_ * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar293,auVar122);
  auVar144._0_4_ = auVar19._0_4_ * auVar18._0_4_;
  auVar144._4_4_ = auVar19._4_4_ * auVar18._4_4_;
  auVar144._8_4_ = auVar19._8_4_ * auVar18._8_4_;
  auVar144._12_4_ = auVar19._12_4_ * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar171,auVar122);
  auVar69._0_4_ = auVar19._0_4_ * auVar18._0_4_;
  auVar69._4_4_ = auVar19._4_4_ * auVar18._4_4_;
  auVar69._8_4_ = auVar19._8_4_ * auVar18._8_4_;
  auVar69._12_4_ = auVar19._12_4_ * auVar18._12_4_;
  auVar18 = vpminsd_avx(auVar183,auVar167);
  auVar19 = vpminsd_avx(auVar197,auVar94);
  auVar18 = vmaxps_avx(auVar18,auVar19);
  auVar19 = vpminsd_avx(auVar144,auVar69);
  uVar64 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar235._4_4_ = uVar64;
  auVar235._0_4_ = uVar64;
  auVar235._8_4_ = uVar64;
  auVar235._12_4_ = uVar64;
  auVar19 = vmaxps_avx(auVar19,auVar235);
  auVar18 = vmaxps_avx(auVar18,auVar19);
  local_228._0_4_ = auVar18._0_4_ * 0.99999964;
  local_228._4_4_ = auVar18._4_4_ * 0.99999964;
  local_228._8_4_ = auVar18._8_4_ * 0.99999964;
  local_228._12_4_ = auVar18._12_4_ * 0.99999964;
  auVar18 = vpmaxsd_avx(auVar183,auVar167);
  auVar19 = vpmaxsd_avx(auVar197,auVar94);
  auVar18 = vminps_avx(auVar18,auVar19);
  auVar19 = vpmaxsd_avx(auVar144,auVar69);
  fVar68 = ray->tfar;
  auVar123._4_4_ = fVar68;
  auVar123._0_4_ = fVar68;
  auVar123._8_4_ = fVar68;
  auVar123._12_4_ = fVar68;
  auVar19 = vminps_avx(auVar19,auVar123);
  auVar18 = vminps_avx(auVar18,auVar19);
  auVar154._0_4_ = auVar18._0_4_ * 1.0000004;
  auVar154._4_4_ = auVar18._4_4_ * 1.0000004;
  auVar154._8_4_ = auVar18._8_4_ * 1.0000004;
  auVar154._12_4_ = auVar18._12_4_ * 1.0000004;
  local_548 = (float)CONCAT31(0,PVar8);
  auVar95[4] = PVar8;
  auVar95._0_4_ = local_548;
  auVar95._5_3_ = 0;
  auVar95[8] = PVar8;
  auVar95._9_3_ = 0;
  auVar95[0xc] = PVar8;
  auVar95._13_3_ = 0;
  auVar19 = vpcmpgtd_avx(auVar95,_DAT_01f4ad30);
  auVar18 = vcmpps_avx(local_228,auVar154,2);
  auVar18 = vandps_avx(auVar18,auVar19);
  auVar118._16_16_ = mm_lookupmask_ps._240_16_;
  auVar118._0_16_ = mm_lookupmask_ps._240_16_;
  uVar64 = vmovmskps_avx(auVar18);
  uVar57 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar64);
  local_1b8 = vblendps_avx(auVar118,ZEXT832(0) << 0x20,0x80);
  local_300 = prim;
LAB_01237585:
  if (uVar57 == 0) {
LAB_012395a4:
    return uVar57 != 0;
  }
  lVar67 = 0;
  for (uVar58 = uVar57; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  local_430 = (ulong)*(uint *)(local_300 + 2);
  local_308 = (ulong)*(uint *)(local_300 + lVar67 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[local_430].ptr;
  fVar68 = (pGVar9->time_range).lower;
  fVar142 = pGVar9->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar68) / ((pGVar9->time_range).upper - fVar68));
  auVar18 = vroundss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),9);
  auVar18 = vminss_avx(auVar18,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar266 = vmaxss_avx(ZEXT816(0),auVar18);
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           local_308 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar65 = (long)(int)auVar266._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar65);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar65);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar58);
  lVar67 = uVar58 + 1;
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar67);
  lVar1 = uVar58 + 2;
  auVar157 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar58 + 3;
  pauVar3 = (undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  auVar235 = *pauVar3;
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar65);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar65);
  auVar20 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar58);
  auVar171 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar67);
  auVar21 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar68 = *pfVar4;
  fVar91 = pfVar4[1];
  fVar141 = pfVar4[2];
  fVar90 = pfVar4[3];
  auVar143 = ZEXT816(0) << 0x40;
  auVar264._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar264._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar264._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar264._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.0;
  auVar145._8_4_ = 0x3e2aaaab;
  auVar145._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar145._12_4_ = 0x3e2aaaab;
  auVar69 = vfmadd213ps_fma(auVar145,auVar157,auVar264);
  auVar305._8_4_ = 0x3f000000;
  auVar305._0_8_ = 0x3f0000003f000000;
  auVar305._12_4_ = 0x3f000000;
  auVar17 = vfmadd231ps_fma(auVar264,auVar157,auVar305);
  auVar17 = vfnmadd231ps_fma(auVar17,auVar19,auVar143);
  auVar167 = vfnmadd231ps_fma(auVar17,auVar18,auVar305);
  auVar184._0_4_ = fVar68 * 0.0;
  auVar184._4_4_ = fVar91 * 0.0;
  auVar184._8_4_ = fVar141 * 0.0;
  auVar184._12_4_ = fVar90 * 0.0;
  auVar17 = vfmadd213ps_fma(auVar145,auVar21,auVar184);
  auVar146._8_4_ = 0x3f2aaaab;
  auVar146._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar146._12_4_ = 0x3f2aaaab;
  auVar17 = vfmadd231ps_fma(auVar17,auVar171,auVar146);
  auVar17 = vfmadd231ps_fma(auVar17,auVar20,auVar145);
  auVar293 = vfmadd231ps_fma(auVar184,auVar21,auVar305);
  auVar293 = vfnmadd231ps_fma(auVar293,auVar171,auVar143);
  auVar168 = vfnmadd231ps_fma(auVar293,auVar20,auVar305);
  auVar288._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar288._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar288._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar288._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.5;
  auVar293 = vfmadd231ps_fma(auVar288,auVar143,auVar157);
  auVar293 = vfnmadd231ps_fma(auVar293,auVar305,auVar19);
  auVar183 = vfnmadd231ps_fma(auVar293,auVar143,auVar18);
  auVar244._0_4_ = fVar68 * 0.16666667;
  auVar244._4_4_ = fVar91 * 0.16666667;
  auVar244._8_4_ = fVar141 * 0.16666667;
  auVar244._12_4_ = fVar90 * 0.16666667;
  auVar293 = vfmadd231ps_fma(auVar244,auVar21,auVar146);
  auVar293 = vfmadd231ps_fma(auVar293,auVar171,auVar145);
  auVar293 = vfmadd231ps_fma(auVar293,auVar20,auVar143);
  auVar198._0_4_ = fVar68 * 0.5;
  auVar198._4_4_ = fVar91 * 0.5;
  auVar198._8_4_ = fVar141 * 0.5;
  auVar198._12_4_ = fVar90 * 0.5;
  auVar21 = vfmadd231ps_fma(auVar198,auVar143,auVar21);
  auVar171 = vfnmadd231ps_fma(auVar21,auVar305,auVar171);
  auVar21 = vfnmadd231ps_fma(auVar171,auVar143,auVar20);
  auVar20 = vshufps_avx(auVar167,auVar167,0xc9);
  auVar171 = vshufps_avx(auVar17,auVar17,0xc9);
  fVar260 = auVar167._0_4_;
  auVar96._0_4_ = fVar260 * auVar171._0_4_;
  fVar275 = auVar167._4_4_;
  auVar96._4_4_ = fVar275 * auVar171._4_4_;
  fVar276 = auVar167._8_4_;
  auVar96._8_4_ = fVar276 * auVar171._8_4_;
  fVar277 = auVar167._12_4_;
  auVar96._12_4_ = fVar277 * auVar171._12_4_;
  auVar94 = vfmsub231ps_fma(auVar96,auVar20,auVar17);
  auVar171 = vshufps_avx(auVar168,auVar168,0xc9);
  auVar97._0_4_ = fVar260 * auVar171._0_4_;
  auVar97._4_4_ = fVar275 * auVar171._4_4_;
  auVar97._8_4_ = fVar276 * auVar171._8_4_;
  auVar97._12_4_ = fVar277 * auVar171._12_4_;
  auVar95 = vfmsub231ps_fma(auVar97,auVar20,auVar168);
  auVar20 = vshufps_avx(auVar183,auVar183,0xc9);
  auVar171 = vshufps_avx(auVar293,auVar293,0xc9);
  fVar287 = auVar183._0_4_;
  auVar98._0_4_ = fVar287 * auVar171._0_4_;
  fVar300 = auVar183._4_4_;
  auVar98._4_4_ = fVar300 * auVar171._4_4_;
  fVar301 = auVar183._8_4_;
  auVar98._8_4_ = fVar301 * auVar171._8_4_;
  fVar302 = auVar183._12_4_;
  auVar98._12_4_ = fVar302 * auVar171._12_4_;
  auVar122 = vfmsub231ps_fma(auVar98,auVar20,auVar293);
  auVar171 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar99._0_4_ = fVar287 * auVar171._0_4_;
  auVar99._4_4_ = fVar300 * auVar171._4_4_;
  auVar99._8_4_ = fVar301 * auVar171._8_4_;
  auVar99._12_4_ = fVar302 * auVar171._12_4_;
  auVar123 = vfmsub231ps_fma(auVar99,auVar20,auVar21);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar65);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar65);
  auVar20 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  pauVar5 = (undefined1 (*) [12])(lVar12 + lVar13 * lVar2);
  auVar55 = *pauVar5;
  fVar140 = *(float *)pauVar5[1];
  lVar14 = *(long *)(lVar11 + 0x38 + lVar65);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar65);
  auVar245._0_4_ = *(float *)*pauVar5 * 0.0;
  auVar245._4_4_ = *(float *)(*pauVar5 + 4) * 0.0;
  auVar245._8_4_ = *(float *)(*pauVar5 + 8) * 0.0;
  auVar245._12_4_ = fVar140 * 0.0;
  auVar154 = vfmadd213ps_fma(auVar145,auVar20,auVar245);
  auVar21 = vfmadd231ps_fma(auVar245,auVar20,auVar305);
  auVar171 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar67);
  auVar17 = vfnmadd231ps_fma(auVar21,auVar171,auVar143);
  auVar21 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar58);
  auVar197 = vfnmadd231ps_fma(auVar17,auVar21,auVar305);
  auVar17 = *(undefined1 (*) [16])(lVar14 + lVar1 * lVar11);
  pfVar4 = (float *)(lVar14 + lVar11 * lVar2);
  fVar68 = *pfVar4;
  fVar91 = pfVar4[1];
  fVar141 = pfVar4[2];
  fVar90 = pfVar4[3];
  auVar70._0_4_ = fVar68 * 0.0;
  auVar70._4_4_ = fVar91 * 0.0;
  auVar70._8_4_ = fVar141 * 0.0;
  auVar70._12_4_ = fVar90 * 0.0;
  auVar168 = vfmadd213ps_fma(auVar145,auVar17,auVar70);
  auVar293 = *(undefined1 (*) [16])(lVar14 + lVar67 * lVar11);
  auVar100._8_4_ = 0x3f2aaaab;
  auVar100._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar100._12_4_ = 0x3f2aaaab;
  auVar282 = vfmadd231ps_fma(auVar168,auVar293,auVar100);
  auVar168 = *(undefined1 (*) [16])(lVar14 + uVar58 * lVar11);
  auVar101 = vfmadd231ps_fma(auVar282,auVar168,auVar145);
  auVar282 = vshufps_avx(auVar101,auVar101,0xc9);
  fVar242 = auVar197._0_4_;
  auVar213._0_4_ = fVar242 * auVar282._0_4_;
  fVar257 = auVar197._4_4_;
  auVar213._4_4_ = fVar257 * auVar282._4_4_;
  fVar258 = auVar197._8_4_;
  auVar213._8_4_ = fVar258 * auVar282._8_4_;
  fVar259 = auVar197._12_4_;
  auVar213._12_4_ = fVar259 * auVar282._12_4_;
  auVar282 = vshufps_avx(auVar197,auVar197,0xc9);
  auVar93 = vfmsub231ps_fma(auVar213,auVar282,auVar101);
  auVar101 = vfmadd231ps_fma(auVar70,auVar17,auVar305);
  auVar101 = vfnmadd231ps_fma(auVar101,auVar293,auVar143);
  auVar143 = vfnmadd231ps_fma(auVar101,auVar168,auVar305);
  auVar101 = vshufps_avx(auVar143,auVar143,0xc9);
  auVar214._0_4_ = fVar242 * auVar101._0_4_;
  auVar214._4_4_ = fVar257 * auVar101._4_4_;
  auVar214._8_4_ = fVar258 * auVar101._8_4_;
  auVar214._12_4_ = fVar259 * auVar101._12_4_;
  auVar143 = vfmsub231ps_fma(auVar214,auVar282,auVar143);
  auVar71._0_4_ = fVar68 * 0.16666667;
  auVar71._4_4_ = fVar91 * 0.16666667;
  auVar71._8_4_ = fVar141 * 0.16666667;
  auVar71._12_4_ = fVar90 * 0.16666667;
  auVar320._8_4_ = 0x3f2aaaab;
  auVar320._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar320._12_4_ = 0x3f2aaaab;
  auVar282 = vfmadd231ps_fma(auVar71,auVar17,auVar320);
  auVar147._0_4_ = fVar68 * 0.5;
  auVar147._4_4_ = fVar91 * 0.5;
  auVar147._8_4_ = fVar141 * 0.5;
  auVar147._12_4_ = fVar90 * 0.5;
  auVar101 = ZEXT816(0) << 0x20;
  auVar17 = vfmadd231ps_fma(auVar147,auVar101,auVar17);
  auVar282 = vfmadd231ps_fma(auVar282,auVar293,auVar145);
  auVar17 = vfnmadd231ps_fma(auVar17,auVar305,auVar293);
  auVar293 = vfmadd231ps_fma(auVar282,auVar168,auVar101);
  auVar168 = vfnmadd231ps_fma(auVar17,auVar101,auVar168);
  local_548 = auVar55._0_4_;
  fStack_544 = auVar55._4_4_;
  fStack_540 = auVar55._8_4_;
  auVar185._0_4_ = local_548 * 0.5;
  auVar185._4_4_ = fStack_544 * 0.5;
  auVar185._8_4_ = fStack_540 * 0.5;
  auVar185._12_4_ = fVar140 * 0.5;
  auVar17 = vfmadd231ps_fma(auVar185,auVar101,auVar20);
  auVar17 = vfnmadd231ps_fma(auVar17,auVar305,auVar171);
  auVar234 = vfnmadd231ps_fma(auVar17,auVar101,auVar21);
  auVar17 = vshufps_avx(auVar293,auVar293,0xc9);
  fVar228 = auVar234._0_4_;
  auVar102._0_4_ = fVar228 * auVar17._0_4_;
  fVar230 = auVar234._4_4_;
  auVar102._4_4_ = fVar230 * auVar17._4_4_;
  fVar232 = auVar234._8_4_;
  auVar102._8_4_ = fVar232 * auVar17._8_4_;
  fVar233 = auVar234._12_4_;
  auVar102._12_4_ = fVar233 * auVar17._12_4_;
  auVar17 = vshufps_avx(auVar234,auVar234,0xc9);
  auVar144 = vfmsub231ps_fma(auVar102,auVar17,auVar293);
  auVar293 = vshufps_avx(auVar168,auVar168,0xc9);
  auVar72._0_4_ = fVar228 * auVar293._0_4_;
  auVar72._4_4_ = fVar230 * auVar293._4_4_;
  auVar72._8_4_ = fVar232 * auVar293._8_4_;
  auVar72._12_4_ = fVar233 * auVar293._12_4_;
  auVar166 = vfmsub231ps_fma(auVar72,auVar17,auVar168);
  fVar142 = fVar142 - auVar266._0_4_;
  local_458._0_4_ = auVar235._0_4_;
  local_458._4_4_ = auVar235._4_4_;
  uStack_450._0_4_ = auVar235._8_4_;
  uStack_450._4_4_ = auVar235._12_4_;
  auVar103._0_4_ = (float)local_458._0_4_ * 0.16666667;
  auVar103._4_4_ = (float)local_458._4_4_ * 0.16666667;
  auVar103._8_4_ = (float)uStack_450 * 0.16666667;
  auVar103._12_4_ = uStack_450._4_4_ * 0.16666667;
  auVar17 = vfmadd231ps_fma(auVar103,auVar320,auVar157);
  auVar168 = vfmadd231ps_fma(auVar69,auVar19,auVar320);
  auVar293 = vpermilps_avx(auVar94,0xc9);
  auVar157 = vdpps_avx(auVar293,auVar293,0x7f);
  auVar19 = vfmadd231ps_fma(auVar17,auVar19,auVar145);
  auVar266 = vfmadd231ps_fma(auVar168,auVar18,auVar145);
  auVar51._12_4_ = 0;
  auVar51._0_12_ = ZEXT812(0);
  auVar282 = vfmadd231ps_fma(auVar19,auVar18,auVar51 << 0x20);
  fVar91 = auVar157._0_4_;
  auVar168 = ZEXT416((uint)fVar91);
  auVar18 = vrsqrtss_avx(auVar168,auVar168);
  fVar68 = auVar18._0_4_;
  fVar68 = fVar91 * -0.5 * fVar68 * fVar68 * fVar68 + fVar68 * 1.5;
  auVar19 = vpermilps_avx(auVar95,0xc9);
  auVar18 = vdpps_avx(auVar293,auVar19,0x7f);
  auVar306._0_4_ = fVar91 * auVar19._0_4_;
  auVar306._4_4_ = fVar91 * auVar19._4_4_;
  auVar306._8_4_ = fVar91 * auVar19._8_4_;
  auVar306._12_4_ = fVar91 * auVar19._12_4_;
  fVar91 = auVar18._0_4_;
  auVar314._0_4_ = fVar91 * auVar293._0_4_;
  auVar314._4_4_ = fVar91 * auVar293._4_4_;
  auVar314._8_4_ = fVar91 * auVar293._8_4_;
  auVar314._12_4_ = fVar91 * auVar293._12_4_;
  auVar17 = vsubps_avx(auVar306,auVar314);
  auVar18 = vrcpss_avx(auVar168,auVar168);
  auVar19 = vfnmadd213ss_fma(auVar157,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar141 = auVar18._0_4_ * auVar19._0_4_;
  auVar168 = vpermilps_avx(auVar122,0xc9);
  auVar19 = vdpps_avx(auVar168,auVar168,0x7f);
  fVar212 = auVar293._0_4_ * fVar68;
  fVar227 = auVar293._4_4_ * fVar68;
  fVar229 = auVar293._8_4_ * fVar68;
  fVar231 = auVar293._12_4_ * fVar68;
  auVar293 = vpermilps_avx(auVar123,0xc9);
  auVar18 = vblendps_avx(auVar19,_DAT_01f45a50,0xe);
  auVar157 = vrsqrtss_avx(auVar18,auVar18);
  fVar90 = auVar19._0_4_;
  fVar91 = auVar157._0_4_;
  auVar157 = vdpps_avx(auVar168,auVar293,0x7f);
  fVar91 = fVar91 * 1.5 + fVar91 * fVar90 * -0.5 * fVar91 * fVar91;
  auVar148._0_4_ = fVar90 * auVar293._0_4_;
  auVar148._4_4_ = fVar90 * auVar293._4_4_;
  auVar148._8_4_ = fVar90 * auVar293._8_4_;
  auVar148._12_4_ = fVar90 * auVar293._12_4_;
  fVar90 = auVar157._0_4_;
  auVar124._0_4_ = fVar90 * auVar168._0_4_;
  auVar124._4_4_ = fVar90 * auVar168._4_4_;
  auVar124._8_4_ = fVar90 * auVar168._8_4_;
  auVar124._12_4_ = fVar90 * auVar168._12_4_;
  auVar157 = vsubps_avx(auVar148,auVar124);
  auVar18 = vrcpss_avx(auVar18,auVar18);
  auVar19 = vfnmadd213ss_fma(auVar19,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar90 = auVar19._0_4_ * auVar18._0_4_;
  fVar139 = auVar168._0_4_ * fVar91;
  fVar163 = auVar168._4_4_ * fVar91;
  fVar164 = auVar168._8_4_ * fVar91;
  fVar165 = auVar168._12_4_ * fVar91;
  auVar18 = vshufps_avx(auVar167,auVar167,0xff);
  auVar19 = vshufps_avx(auVar266,auVar266,0xff);
  auVar199._0_4_ = auVar19._0_4_ * fVar212;
  auVar199._4_4_ = auVar19._4_4_ * fVar227;
  auVar199._8_4_ = auVar19._8_4_ * fVar229;
  auVar199._12_4_ = auVar19._12_4_ * fVar231;
  auVar169._0_4_ = auVar18._0_4_ * fVar212 + fVar68 * auVar17._0_4_ * fVar141 * auVar19._0_4_;
  auVar169._4_4_ = auVar18._4_4_ * fVar227 + fVar68 * auVar17._4_4_ * fVar141 * auVar19._4_4_;
  auVar169._8_4_ = auVar18._8_4_ * fVar229 + fVar68 * auVar17._8_4_ * fVar141 * auVar19._8_4_;
  auVar169._12_4_ = auVar18._12_4_ * fVar231 + fVar68 * auVar17._12_4_ * fVar141 * auVar19._12_4_;
  auVar17 = vsubps_avx(auVar266,auVar199);
  local_538._0_4_ = auVar266._0_4_ + auVar199._0_4_;
  local_538._4_4_ = auVar266._4_4_ + auVar199._4_4_;
  uStack_530._0_4_ = auVar266._8_4_ + auVar199._8_4_;
  uStack_530._4_4_ = auVar266._12_4_ + auVar199._12_4_;
  auVar293 = vsubps_avx(auVar167,auVar169);
  auVar18 = vshufps_avx(auVar183,auVar183,0xff);
  auVar19 = vshufps_avx(auVar282,auVar282,0xff);
  auVar149._0_4_ = auVar19._0_4_ * fVar139;
  auVar149._4_4_ = auVar19._4_4_ * fVar163;
  auVar149._8_4_ = auVar19._8_4_ * fVar164;
  auVar149._12_4_ = auVar19._12_4_ * fVar165;
  auVar170._0_4_ = auVar18._0_4_ * fVar139 + auVar19._0_4_ * fVar91 * auVar157._0_4_ * fVar90;
  auVar170._4_4_ = auVar18._4_4_ * fVar163 + auVar19._4_4_ * fVar91 * auVar157._4_4_ * fVar90;
  auVar170._8_4_ = auVar18._8_4_ * fVar164 + auVar19._8_4_ * fVar91 * auVar157._8_4_ * fVar90;
  auVar170._12_4_ = auVar18._12_4_ * fVar165 + auVar19._12_4_ * fVar91 * auVar157._12_4_ * fVar90;
  auVar157 = vsubps_avx(auVar282,auVar149);
  local_458._4_4_ = auVar282._4_4_ + auVar149._4_4_;
  local_458._0_4_ = auVar282._0_4_ + auVar149._0_4_;
  uStack_450._0_4_ = auVar282._8_4_ + auVar149._8_4_;
  uStack_450._4_4_ = auVar282._12_4_ + auVar149._12_4_;
  auVar168 = vsubps_avx(auVar183,auVar170);
  auVar125._8_4_ = 0x3e2aaaab;
  auVar125._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar125._12_4_ = 0x3e2aaaab;
  auVar307._0_4_ = local_548 * 0.16666667;
  auVar307._4_4_ = fStack_544 * 0.16666667;
  auVar307._8_4_ = fStack_540 * 0.16666667;
  auVar307._12_4_ = fVar140 * 0.16666667;
  auVar104._8_4_ = 0x3f2aaaab;
  auVar104._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar104._12_4_ = 0x3f2aaaab;
  auVar19 = vfmadd231ps_fma(auVar307,auVar104,auVar20);
  auVar20 = vfmadd231ps_fma(auVar154,auVar171,auVar104);
  auVar266 = vpermilps_avx(auVar93,0xc9);
  auVar18 = vdpps_avx(auVar266,auVar266,0x7f);
  auVar19 = vfmadd231ps_fma(auVar19,auVar171,auVar125);
  auVar282 = vfmadd231ps_fma(auVar20,auVar21,auVar125);
  auVar52._12_4_ = 0;
  auVar52._0_12_ = ZEXT812(0);
  auVar101 = vfmadd231ps_fma(auVar19,auVar21,auVar52 << 0x20);
  fVar91 = auVar18._0_4_;
  auVar171 = ZEXT416((uint)fVar91);
  auVar19 = vrsqrtss_avx(auVar171,auVar171);
  fVar68 = auVar19._0_4_;
  fVar68 = fVar68 * 1.5 + fVar68 * fVar68 * fVar91 * -0.5 * fVar68;
  auVar20 = vpermilps_avx(auVar143,0xc9);
  auVar19 = vdpps_avx(auVar266,auVar20,0x7f);
  auVar215._0_4_ = fVar91 * auVar20._0_4_;
  auVar215._4_4_ = fVar91 * auVar20._4_4_;
  auVar215._8_4_ = fVar91 * auVar20._8_4_;
  auVar215._12_4_ = fVar91 * auVar20._12_4_;
  fVar91 = auVar19._0_4_;
  auVar265._0_4_ = fVar91 * auVar266._0_4_;
  auVar265._4_4_ = fVar91 * auVar266._4_4_;
  auVar265._8_4_ = fVar91 * auVar266._8_4_;
  auVar265._12_4_ = fVar91 * auVar266._12_4_;
  auVar20 = vsubps_avx(auVar215,auVar265);
  auVar19 = vrcpss_avx(auVar171,auVar171);
  auVar18 = vfnmadd213ss_fma(auVar18,auVar19,SUB6416(ZEXT464(0x40000000),0));
  fVar141 = auVar19._0_4_ * auVar18._0_4_;
  auVar21 = vpermilps_avx(auVar144,0xc9);
  auVar18 = vdpps_avx(auVar21,auVar21,0x7f);
  fVar140 = auVar266._0_4_ * fVar68;
  fVar139 = auVar266._4_4_ * fVar68;
  fVar163 = auVar266._8_4_ * fVar68;
  fVar164 = auVar266._12_4_ * fVar68;
  auVar171 = vpermilps_avx(auVar166,0xc9);
  fVar90 = auVar18._0_4_;
  auVar266 = ZEXT416((uint)fVar90);
  auVar19 = vrsqrtss_avx(auVar266,auVar266);
  fVar91 = auVar19._0_4_;
  auVar19 = vdpps_avx(auVar21,auVar171,0x7f);
  fVar91 = fVar91 * 1.5 + fVar90 * -0.5 * fVar91 * fVar91 * fVar91;
  auVar172._0_4_ = fVar90 * auVar171._0_4_;
  auVar172._4_4_ = fVar90 * auVar171._4_4_;
  auVar172._8_4_ = fVar90 * auVar171._8_4_;
  auVar172._12_4_ = fVar90 * auVar171._12_4_;
  fVar90 = auVar19._0_4_;
  auVar289._0_4_ = fVar90 * auVar21._0_4_;
  auVar289._4_4_ = fVar90 * auVar21._4_4_;
  auVar289._8_4_ = fVar90 * auVar21._8_4_;
  auVar289._12_4_ = fVar90 * auVar21._12_4_;
  auVar171 = vsubps_avx(auVar172,auVar289);
  auVar19 = vrcpss_avx(auVar266,auVar266);
  auVar18 = vfnmadd213ss_fma(auVar18,auVar19,ZEXT416(0x40000000));
  fVar90 = auVar19._0_4_ * auVar18._0_4_;
  fVar165 = auVar21._0_4_ * fVar91;
  fVar212 = auVar21._4_4_ * fVar91;
  fVar227 = auVar21._8_4_ * fVar91;
  fVar229 = auVar21._12_4_ * fVar91;
  auVar18 = vshufps_avx(auVar197,auVar197,0xff);
  auVar19 = vshufps_avx(auVar282,auVar282,0xff);
  auVar150._0_4_ = auVar19._0_4_ * fVar140;
  auVar150._4_4_ = auVar19._4_4_ * fVar139;
  auVar150._8_4_ = auVar19._8_4_ * fVar163;
  auVar150._12_4_ = auVar19._12_4_ * fVar164;
  auVar105._0_4_ = auVar18._0_4_ * fVar140 + auVar19._0_4_ * fVar68 * fVar141 * auVar20._0_4_;
  auVar105._4_4_ = auVar18._4_4_ * fVar139 + auVar19._4_4_ * fVar68 * fVar141 * auVar20._4_4_;
  auVar105._8_4_ = auVar18._8_4_ * fVar163 + auVar19._8_4_ * fVar68 * fVar141 * auVar20._8_4_;
  auVar105._12_4_ = auVar18._12_4_ * fVar164 + auVar19._12_4_ * fVar68 * fVar141 * auVar20._12_4_;
  auVar20 = vsubps_avx(auVar282,auVar150);
  fVar141 = auVar282._0_4_ + auVar150._0_4_;
  fVar140 = auVar282._4_4_ + auVar150._4_4_;
  fVar139 = auVar282._8_4_ + auVar150._8_4_;
  fVar163 = auVar282._12_4_ + auVar150._12_4_;
  auVar21 = vsubps_avx(auVar197,auVar105);
  auVar18 = vshufps_avx(auVar234,auVar234,0xff);
  auVar19 = vshufps_avx(auVar101,auVar101,0xff);
  auVar290._0_4_ = auVar19._0_4_ * fVar165;
  auVar290._4_4_ = auVar19._4_4_ * fVar212;
  auVar290._8_4_ = auVar19._8_4_ * fVar227;
  auVar290._12_4_ = auVar19._12_4_ * fVar229;
  auVar106._0_4_ = auVar18._0_4_ * fVar165 + auVar19._0_4_ * fVar91 * auVar171._0_4_ * fVar90;
  auVar106._4_4_ = auVar18._4_4_ * fVar212 + auVar19._4_4_ * fVar91 * auVar171._4_4_ * fVar90;
  auVar106._8_4_ = auVar18._8_4_ * fVar227 + auVar19._8_4_ * fVar91 * auVar171._8_4_ * fVar90;
  auVar106._12_4_ = auVar18._12_4_ * fVar229 + auVar19._12_4_ * fVar91 * auVar171._12_4_ * fVar90;
  auVar18 = vsubps_avx(auVar101,auVar290);
  auVar173._0_4_ = auVar101._0_4_ + auVar290._0_4_;
  auVar173._4_4_ = auVar101._4_4_ + auVar290._4_4_;
  auVar173._8_4_ = auVar101._8_4_ + auVar290._8_4_;
  auVar173._12_4_ = auVar101._12_4_ + auVar290._12_4_;
  auVar19 = vsubps_avx(auVar234,auVar106);
  local_3c8._0_4_ = auVar293._0_4_;
  local_3c8._4_4_ = auVar293._4_4_;
  fStack_3c0 = auVar293._8_4_;
  fStack_3bc = auVar293._12_4_;
  auVar186._0_4_ = auVar17._0_4_ + (float)local_3c8._0_4_ * 0.33333334;
  auVar186._4_4_ = auVar17._4_4_ + (float)local_3c8._4_4_ * 0.33333334;
  auVar186._8_4_ = auVar17._8_4_ + fStack_3c0 * 0.33333334;
  auVar186._12_4_ = auVar17._12_4_ + fStack_3bc * 0.33333334;
  fVar68 = 1.0 - fVar142;
  auVar107._4_4_ = fVar68;
  auVar107._0_4_ = fVar68;
  auVar107._8_4_ = fVar68;
  auVar107._12_4_ = fVar68;
  auVar291._0_4_ = fVar142 * auVar20._0_4_;
  auVar291._4_4_ = fVar142 * auVar20._4_4_;
  auVar291._8_4_ = fVar142 * auVar20._8_4_;
  auVar291._12_4_ = fVar142 * auVar20._12_4_;
  local_338 = vfmadd231ps_fma(auVar291,auVar107,auVar17);
  auVar126._0_4_ = fVar142 * (auVar20._0_4_ + auVar21._0_4_ * 0.33333334);
  auVar126._4_4_ = fVar142 * (auVar20._4_4_ + auVar21._4_4_ * 0.33333334);
  auVar126._8_4_ = fVar142 * (auVar20._8_4_ + auVar21._8_4_ * 0.33333334);
  auVar126._12_4_ = fVar142 * (auVar20._12_4_ + auVar21._12_4_ * 0.33333334);
  local_348 = vfmadd231ps_fma(auVar126,auVar107,auVar186);
  local_428._0_4_ = auVar168._0_4_;
  local_428._4_4_ = auVar168._4_4_;
  fStack_420 = auVar168._8_4_;
  fStack_41c = auVar168._12_4_;
  auVar127._0_4_ = (float)local_428._0_4_ * 0.33333334;
  auVar127._4_4_ = (float)local_428._4_4_ * 0.33333334;
  auVar127._8_4_ = fStack_420 * 0.33333334;
  auVar127._12_4_ = fStack_41c * 0.33333334;
  auVar20 = vsubps_avx(auVar157,auVar127);
  local_518._4_4_ = (float)local_538._4_4_ + (fVar275 + auVar169._4_4_) * 0.33333334;
  local_518._0_4_ = (float)local_538._0_4_ + (fVar260 + auVar169._0_4_) * 0.33333334;
  fStack_510 = (float)uStack_530 + (fVar276 + auVar169._8_4_) * 0.33333334;
  fStack_50c = uStack_530._4_4_ + (fVar277 + auVar169._12_4_) * 0.33333334;
  auVar236._0_4_ = (fVar287 + auVar170._0_4_) * 0.33333334;
  auVar236._4_4_ = (fVar300 + auVar170._4_4_) * 0.33333334;
  auVar236._8_4_ = (fVar301 + auVar170._8_4_) * 0.33333334;
  auVar236._12_4_ = (fVar302 + auVar170._12_4_) * 0.33333334;
  auVar171 = vsubps_avx(_local_458,auVar236);
  auVar280._0_4_ = auVar19._0_4_ * 0.33333334;
  auVar280._4_4_ = auVar19._4_4_ * 0.33333334;
  auVar280._8_4_ = auVar19._8_4_ * 0.33333334;
  auVar280._12_4_ = auVar19._12_4_ * 0.33333334;
  auVar19 = vsubps_avx(auVar18,auVar280);
  auVar246._0_4_ = (fVar228 + auVar106._0_4_) * 0.33333334;
  auVar246._4_4_ = (fVar230 + auVar106._4_4_) * 0.33333334;
  auVar246._8_4_ = (fVar232 + auVar106._8_4_) * 0.33333334;
  auVar246._12_4_ = (fVar233 + auVar106._12_4_) * 0.33333334;
  auVar21 = vsubps_avx(auVar173,auVar246);
  auVar281._0_4_ = fVar142 * auVar19._0_4_;
  auVar281._4_4_ = fVar142 * auVar19._4_4_;
  auVar281._8_4_ = fVar142 * auVar19._8_4_;
  auVar281._12_4_ = fVar142 * auVar19._12_4_;
  auVar216._0_4_ = fVar142 * auVar18._0_4_;
  auVar216._4_4_ = fVar142 * auVar18._4_4_;
  auVar216._8_4_ = fVar142 * auVar18._8_4_;
  auVar216._12_4_ = fVar142 * auVar18._12_4_;
  local_358 = vfmadd231ps_fma(auVar281,auVar107,auVar20);
  local_368 = vfmadd231ps_fma(auVar216,auVar107,auVar157);
  auVar128._0_4_ = fVar142 * fVar141;
  auVar128._4_4_ = fVar142 * fVar140;
  auVar128._8_4_ = fVar142 * fVar139;
  auVar128._12_4_ = fVar142 * fVar163;
  auVar151._0_4_ = fVar142 * (fVar141 + (fVar242 + auVar105._0_4_) * 0.33333334);
  auVar151._4_4_ = fVar142 * (fVar140 + (fVar257 + auVar105._4_4_) * 0.33333334);
  auVar151._8_4_ = fVar142 * (fVar139 + (fVar258 + auVar105._8_4_) * 0.33333334);
  auVar151._12_4_ = fVar142 * (fVar163 + (fVar259 + auVar105._12_4_) * 0.33333334);
  auVar200._0_4_ = fVar142 * auVar21._0_4_;
  auVar200._4_4_ = fVar142 * auVar21._4_4_;
  auVar200._8_4_ = fVar142 * auVar21._8_4_;
  auVar200._12_4_ = fVar142 * auVar21._12_4_;
  auVar174._0_4_ = fVar142 * auVar173._0_4_;
  auVar174._4_4_ = fVar142 * auVar173._4_4_;
  auVar174._8_4_ = fVar142 * auVar173._8_4_;
  auVar174._12_4_ = fVar142 * auVar173._12_4_;
  _local_378 = vfmadd231ps_fma(auVar128,auVar107,_local_538);
  _local_3d8 = vfmadd231ps_fma(auVar151,auVar107,_local_518);
  _local_388 = vfmadd231ps_fma(auVar200,auVar107,auVar171);
  _local_3e8 = vfmadd231ps_fma(auVar174,auVar107,_local_458);
  aVar6 = (ray->org).field_0;
  auVar157 = vsubps_avx(local_338,(undefined1  [16])aVar6);
  auVar18 = vshufps_avx(auVar157,auVar157,0x55);
  auVar19 = vshufps_avx(auVar157,auVar157,0xaa);
  aVar7 = (pre->ray_space).vy.field_0;
  fVar68 = (pre->ray_space).vz.field_0.m128[0];
  fVar91 = (pre->ray_space).vz.field_0.m128[1];
  fVar142 = (pre->ray_space).vz.field_0.m128[2];
  fVar141 = (pre->ray_space).vz.field_0.m128[3];
  auVar175._0_4_ = fVar68 * auVar19._0_4_;
  auVar175._4_4_ = fVar91 * auVar19._4_4_;
  auVar175._8_4_ = fVar142 * auVar19._8_4_;
  auVar175._12_4_ = fVar141 * auVar19._12_4_;
  auVar266 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar7,auVar18);
  auVar20 = vsubps_avx(local_348,(undefined1  [16])aVar6);
  auVar18 = vshufps_avx(auVar20,auVar20,0x55);
  auVar19 = vshufps_avx(auVar20,auVar20,0xaa);
  auVar108._0_4_ = fVar68 * auVar19._0_4_;
  auVar108._4_4_ = fVar91 * auVar19._4_4_;
  auVar108._8_4_ = fVar142 * auVar19._8_4_;
  auVar108._12_4_ = fVar141 * auVar19._12_4_;
  auVar282 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar7,auVar18);
  auVar19 = vsubps_avx(local_358,(undefined1  [16])aVar6);
  auVar18 = vshufps_avx(auVar19,auVar19,0xaa);
  auVar129._0_4_ = fVar68 * auVar18._0_4_;
  auVar129._4_4_ = fVar91 * auVar18._4_4_;
  auVar129._8_4_ = fVar142 * auVar18._8_4_;
  auVar129._12_4_ = fVar141 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar19,auVar19,0x55);
  auVar101 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar7,auVar18);
  auVar171 = vsubps_avx(local_368,(undefined1  [16])aVar6);
  auVar18 = vshufps_avx(auVar171,auVar171,0xaa);
  auVar152._0_4_ = fVar68 * auVar18._0_4_;
  auVar152._4_4_ = fVar91 * auVar18._4_4_;
  auVar152._8_4_ = fVar142 * auVar18._8_4_;
  auVar152._12_4_ = fVar141 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar171,auVar171,0x55);
  auVar69 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar7,auVar18);
  auVar21 = vsubps_avx(_local_378,(undefined1  [16])aVar6);
  auVar18 = vshufps_avx(auVar21,auVar21,0xaa);
  auVar187._0_4_ = fVar68 * auVar18._0_4_;
  auVar187._4_4_ = fVar91 * auVar18._4_4_;
  auVar187._8_4_ = fVar142 * auVar18._8_4_;
  auVar187._12_4_ = fVar141 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar21,auVar21,0x55);
  auVar154 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar7,auVar18);
  auVar17 = vsubps_avx(_local_3d8,(undefined1  [16])aVar6);
  auVar18 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar247._0_4_ = fVar68 * auVar18._0_4_;
  auVar247._4_4_ = fVar91 * auVar18._4_4_;
  auVar247._8_4_ = fVar142 * auVar18._8_4_;
  auVar247._12_4_ = fVar141 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar17,auVar17,0x55);
  auVar94 = vfmadd231ps_fma(auVar247,(undefined1  [16])aVar7,auVar18);
  auVar293 = vsubps_avx(_local_388,(undefined1  [16])aVar6);
  auVar18 = vshufps_avx(auVar293,auVar293,0xaa);
  auVar292._0_4_ = fVar68 * auVar18._0_4_;
  auVar292._4_4_ = fVar91 * auVar18._4_4_;
  auVar292._8_4_ = fVar142 * auVar18._8_4_;
  auVar292._12_4_ = fVar141 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar293,auVar293,0x55);
  auVar95 = vfmadd231ps_fma(auVar292,(undefined1  [16])aVar7,auVar18);
  auVar168 = vsubps_avx(_local_3e8,(undefined1  [16])aVar6);
  auVar18 = vshufps_avx(auVar168,auVar168,0xaa);
  auVar217._0_4_ = fVar68 * auVar18._0_4_;
  auVar217._4_4_ = fVar91 * auVar18._4_4_;
  auVar217._8_4_ = fVar142 * auVar18._8_4_;
  auVar217._12_4_ = fVar141 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar168,auVar168,0x55);
  auVar18 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar7,auVar18);
  local_538._0_4_ = auVar157._0_4_;
  auVar201._4_4_ = local_538._0_4_;
  auVar201._0_4_ = local_538._0_4_;
  auVar201._8_4_ = local_538._0_4_;
  auVar201._12_4_ = local_538._0_4_;
  aVar7 = (pre->ray_space).vx.field_0;
  auVar266 = vfmadd231ps_fma(auVar266,(undefined1  [16])aVar7,auVar201);
  local_548 = auVar20._0_4_;
  auVar202._4_4_ = local_548;
  auVar202._0_4_ = local_548;
  auVar202._8_4_ = local_548;
  auVar202._12_4_ = local_548;
  auVar282 = vfmadd231ps_fma(auVar282,(undefined1  [16])aVar7,auVar202);
  uVar64 = auVar19._0_4_;
  auVar203._4_4_ = uVar64;
  auVar203._0_4_ = uVar64;
  auVar203._8_4_ = uVar64;
  auVar203._12_4_ = uVar64;
  auVar101 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar7,auVar203);
  uVar64 = auVar171._0_4_;
  auVar204._4_4_ = uVar64;
  auVar204._0_4_ = uVar64;
  auVar204._8_4_ = uVar64;
  auVar204._12_4_ = uVar64;
  auVar69 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar7,auVar204);
  uVar64 = auVar21._0_4_;
  auVar205._4_4_ = uVar64;
  auVar205._0_4_ = uVar64;
  auVar205._8_4_ = uVar64;
  auVar205._12_4_ = uVar64;
  auVar21 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar7,auVar205);
  uVar64 = auVar17._0_4_;
  auVar206._4_4_ = uVar64;
  auVar206._0_4_ = uVar64;
  auVar206._8_4_ = uVar64;
  auVar206._12_4_ = uVar64;
  auVar17 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar7,auVar206);
  auVar73._0_4_ = auVar293._0_4_;
  auVar73._4_4_ = auVar73._0_4_;
  auVar73._8_4_ = auVar73._0_4_;
  auVar73._12_4_ = auVar73._0_4_;
  auVar293 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar7,auVar73);
  uVar64 = auVar168._0_4_;
  auVar74._4_4_ = uVar64;
  auVar74._0_4_ = uVar64;
  auVar74._8_4_ = uVar64;
  auVar74._12_4_ = uVar64;
  auVar168 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar7,auVar74);
  local_4e8 = vmovlhps_avx(auVar266,auVar21);
  auVar20 = vmovlhps_avx(auVar282,auVar17);
  auVar171 = vmovlhps_avx(auVar101,auVar293);
  _local_1f8 = vmovlhps_avx(auVar69,auVar168);
  auVar18 = vminps_avx(local_4e8,auVar20);
  auVar19 = vminps_avx(auVar171,_local_1f8);
  auVar157 = vminps_avx(auVar18,auVar19);
  auVar18 = vmaxps_avx(local_4e8,auVar20);
  auVar19 = vmaxps_avx(auVar171,_local_1f8);
  auVar18 = vmaxps_avx(auVar18,auVar19);
  auVar19 = vshufpd_avx(auVar157,auVar157,3);
  auVar157 = vminps_avx(auVar157,auVar19);
  auVar19 = vshufpd_avx(auVar18,auVar18,3);
  auVar19 = vmaxps_avx(auVar18,auVar19);
  auVar18 = vandps_avx(local_2b8,auVar157);
  auVar19 = vandps_avx(local_2b8,auVar19);
  auVar18 = vmaxps_avx(auVar18,auVar19);
  auVar19 = vmovshdup_avx(auVar18);
  auVar18 = vmaxss_avx(auVar19,auVar18);
  local_78 = auVar18._0_4_ * 9.536743e-07;
  local_468._0_8_ = auVar266._0_8_;
  local_468._8_8_ = local_468._0_8_;
  local_478._0_8_ = auVar282._0_8_;
  local_478._8_8_ = local_478._0_8_;
  local_488._8_8_ = auVar101._0_8_;
  local_488._0_8_ = auVar101._0_8_;
  local_498._8_8_ = auVar69._0_8_;
  local_498._0_8_ = auVar69._0_8_;
  register0x00001388 = auVar21._0_8_;
  local_4a8 = auVar21._0_8_;
  register0x000012c8 = auVar17._0_8_;
  local_4b8 = auVar17._0_8_;
  local_4c8 = auVar293._0_8_;
  register0x00001508 = local_4c8;
  register0x00001288 = auVar168._0_8_;
  local_4d8 = auVar168._0_8_;
  local_208 = ZEXT416((uint)local_78);
  local_2c8 = 0x80000000;
  uStack_2c4 = 0x80000000;
  uStack_2c0 = 0x80000000;
  uStack_2bc = 0x80000000;
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  fStack_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = local_78;
  fStack_5c = local_78;
  fStack_90 = -local_78;
  local_98 = -local_78;
  fStack_94 = -local_78;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar66 = false;
  uVar58 = 0;
  local_318 = vsubps_avx(auVar20,local_4e8);
  local_328 = vsubps_avx(auVar171,auVar20);
  local_1e8 = vsubps_avx(_local_1f8,auVar171);
  local_238 = vsubps_avx(_local_378,local_338);
  local_248 = vsubps_avx(_local_3d8,local_348);
  local_258 = vsubps_avx(_local_388,local_358);
  _local_268 = vsubps_avx(_local_3e8,local_368);
  auVar75 = ZEXT816(0x3f80000000000000);
  local_218 = auVar75;
LAB_012381ed:
  auVar18 = vshufps_avx(auVar75,auVar75,0x50);
  auVar321._8_4_ = 0x3f800000;
  auVar321._0_8_ = 0x3f8000003f800000;
  auVar321._12_4_ = 0x3f800000;
  auVar324._16_4_ = 0x3f800000;
  auVar324._0_16_ = auVar321;
  auVar324._20_4_ = 0x3f800000;
  auVar324._24_4_ = 0x3f800000;
  auVar324._28_4_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar321,auVar18);
  fVar68 = auVar18._0_4_;
  auVar76._0_4_ = local_4a8._0_4_ * fVar68;
  fVar91 = auVar18._4_4_;
  auVar76._4_4_ = local_4a8._4_4_ * fVar91;
  fVar142 = auVar18._8_4_;
  auVar76._8_4_ = local_4a8._8_4_ * fVar142;
  fVar141 = auVar18._12_4_;
  auVar76._12_4_ = local_4a8._12_4_ * fVar141;
  auVar207._0_4_ = local_4b8._0_4_ * fVar68;
  auVar207._4_4_ = local_4b8._4_4_ * fVar91;
  auVar207._8_4_ = local_4b8._8_4_ * fVar142;
  auVar207._12_4_ = local_4b8._12_4_ * fVar141;
  auVar176._0_4_ = local_4c8._0_4_ * fVar68;
  auVar176._4_4_ = local_4c8._4_4_ * fVar91;
  auVar176._8_4_ = local_4c8._8_4_ * fVar142;
  auVar176._12_4_ = local_4c8._12_4_ * fVar141;
  auVar130._0_4_ = local_4d8._0_4_ * fVar68;
  auVar130._4_4_ = local_4d8._4_4_ * fVar91;
  auVar130._8_4_ = local_4d8._8_4_ * fVar142;
  auVar130._12_4_ = local_4d8._12_4_ * fVar141;
  auVar17 = vfmadd231ps_fma(auVar76,auVar19,local_468);
  auVar293 = vfmadd231ps_fma(auVar207,auVar19,local_478);
  auVar168 = vfmadd231ps_fma(auVar176,auVar19,local_488);
  auVar266 = vfmadd231ps_fma(auVar130,local_498,auVar19);
  auVar18 = vmovshdup_avx(local_218);
  fVar68 = local_218._0_4_;
  fStack_140 = (auVar18._0_4_ - fVar68) * 0.04761905;
  auVar255._4_4_ = fVar68;
  auVar255._0_4_ = fVar68;
  auVar255._8_4_ = fVar68;
  auVar255._12_4_ = fVar68;
  auVar255._16_4_ = fVar68;
  auVar255._20_4_ = fVar68;
  auVar255._24_4_ = fVar68;
  auVar255._28_4_ = fVar68;
  auVar119._0_8_ = auVar18._0_8_;
  auVar119._8_8_ = auVar119._0_8_;
  auVar119._16_8_ = auVar119._0_8_;
  auVar119._24_8_ = auVar119._0_8_;
  auVar118 = vsubps_avx(auVar119,auVar255);
  uVar64 = auVar17._0_4_;
  auVar318._4_4_ = uVar64;
  auVar318._0_4_ = uVar64;
  auVar318._8_4_ = uVar64;
  auVar318._12_4_ = uVar64;
  auVar318._16_4_ = uVar64;
  auVar318._20_4_ = uVar64;
  auVar318._24_4_ = uVar64;
  auVar318._28_4_ = uVar64;
  auVar18 = vmovshdup_avx(auVar17);
  uVar92 = auVar18._0_8_;
  auVar313._8_8_ = uVar92;
  auVar313._0_8_ = uVar92;
  auVar313._16_8_ = uVar92;
  auVar313._24_8_ = uVar92;
  fVar164 = auVar293._0_4_;
  auVar297._4_4_ = fVar164;
  auVar297._0_4_ = fVar164;
  auVar297._8_4_ = fVar164;
  auVar297._12_4_ = fVar164;
  auVar297._16_4_ = fVar164;
  auVar297._20_4_ = fVar164;
  auVar297._24_4_ = fVar164;
  auVar297._28_4_ = fVar164;
  auVar19 = vmovshdup_avx(auVar293);
  auVar120._0_8_ = auVar19._0_8_;
  auVar120._8_8_ = auVar120._0_8_;
  auVar120._16_8_ = auVar120._0_8_;
  auVar120._24_8_ = auVar120._0_8_;
  fVar163 = auVar168._0_4_;
  auVar224._4_4_ = fVar163;
  auVar224._0_4_ = fVar163;
  auVar224._8_4_ = fVar163;
  auVar224._12_4_ = fVar163;
  auVar224._16_4_ = fVar163;
  auVar224._20_4_ = fVar163;
  auVar224._24_4_ = fVar163;
  auVar224._28_4_ = fVar163;
  auVar157 = vmovshdup_avx(auVar168);
  auVar240._0_8_ = auVar157._0_8_;
  auVar240._8_8_ = auVar240._0_8_;
  auVar240._16_8_ = auVar240._0_8_;
  auVar240._24_8_ = auVar240._0_8_;
  fVar139 = auVar266._0_4_;
  auVar21 = vmovshdup_avx(auVar266);
  auVar282 = vfmadd132ps_fma(auVar118,auVar255,_DAT_01f7b040);
  auVar118 = vsubps_avx(auVar324,ZEXT1632(auVar282));
  fVar68 = auVar282._0_4_;
  fVar91 = auVar282._4_4_;
  auVar22._4_4_ = fVar164 * fVar91;
  auVar22._0_4_ = fVar164 * fVar68;
  fVar142 = auVar282._8_4_;
  auVar22._8_4_ = fVar164 * fVar142;
  fVar141 = auVar282._12_4_;
  auVar22._12_4_ = fVar164 * fVar141;
  auVar22._16_4_ = fVar164 * 0.0;
  auVar22._20_4_ = fVar164 * 0.0;
  auVar22._24_4_ = fVar164 * 0.0;
  auVar22._28_4_ = 0x3f800000;
  auVar282 = vfmadd231ps_fma(auVar22,auVar118,auVar318);
  fVar90 = auVar19._0_4_;
  fVar140 = auVar19._4_4_;
  auVar23._4_4_ = fVar140 * fVar91;
  auVar23._0_4_ = fVar90 * fVar68;
  auVar23._8_4_ = fVar90 * fVar142;
  auVar23._12_4_ = fVar140 * fVar141;
  auVar23._16_4_ = fVar90 * 0.0;
  auVar23._20_4_ = fVar140 * 0.0;
  auVar23._24_4_ = fVar90 * 0.0;
  auVar23._28_4_ = uVar64;
  auVar101 = vfmadd231ps_fma(auVar23,auVar118,auVar313);
  auVar24._4_4_ = fVar163 * fVar91;
  auVar24._0_4_ = fVar163 * fVar68;
  auVar24._8_4_ = fVar163 * fVar142;
  auVar24._12_4_ = fVar163 * fVar141;
  auVar24._16_4_ = fVar163 * 0.0;
  auVar24._20_4_ = fVar163 * 0.0;
  auVar24._24_4_ = fVar163 * 0.0;
  auVar24._28_4_ = auVar18._4_4_;
  auVar69 = vfmadd231ps_fma(auVar24,auVar118,auVar297);
  fVar90 = auVar157._0_4_;
  fVar140 = auVar157._4_4_;
  auVar16._4_4_ = fVar140 * fVar91;
  auVar16._0_4_ = fVar90 * fVar68;
  auVar16._8_4_ = fVar90 * fVar142;
  auVar16._12_4_ = fVar140 * fVar141;
  auVar16._16_4_ = fVar90 * 0.0;
  auVar16._20_4_ = fVar140 * 0.0;
  auVar16._24_4_ = fVar90 * 0.0;
  auVar16._28_4_ = fVar164;
  auVar154 = vfmadd231ps_fma(auVar16,auVar118,auVar120);
  auVar18 = vshufps_avx(auVar17,auVar17,0xaa);
  uStack_450 = auVar18._0_8_;
  local_458 = (undefined1  [8])uStack_450;
  uStack_448 = uStack_450;
  uStack_440 = uStack_450;
  auVar19 = vshufps_avx(auVar17,auVar17,0xff);
  uStack_530 = auVar19._0_8_;
  local_538 = (undefined1  [8])uStack_530;
  uStack_528 = uStack_530;
  uStack_520 = uStack_530;
  auVar25._4_4_ = fVar139 * fVar91;
  auVar25._0_4_ = fVar139 * fVar68;
  auVar25._8_4_ = fVar139 * fVar142;
  auVar25._12_4_ = fVar139 * fVar141;
  auVar25._16_4_ = fVar139 * 0.0;
  auVar25._20_4_ = fVar139 * 0.0;
  auVar25._24_4_ = fVar139 * 0.0;
  auVar25._28_4_ = fVar139;
  auVar17 = vfmadd231ps_fma(auVar25,auVar118,auVar224);
  auVar19 = vshufps_avx(auVar293,auVar293,0xaa);
  auVar225._0_8_ = auVar19._0_8_;
  auVar225._8_8_ = auVar225._0_8_;
  auVar225._16_8_ = auVar225._0_8_;
  auVar225._24_8_ = auVar225._0_8_;
  auVar157 = vshufps_avx(auVar293,auVar293,0xff);
  local_408._8_8_ = auVar157._0_8_;
  local_408._0_8_ = local_408._8_8_;
  local_408._16_8_ = local_408._8_8_;
  local_408._24_8_ = local_408._8_8_;
  fVar90 = auVar21._0_4_;
  fVar140 = auVar21._4_4_;
  auVar299._4_4_ = fVar140 * fVar91;
  auVar299._0_4_ = fVar90 * fVar68;
  auVar299._8_4_ = fVar90 * fVar142;
  auVar299._12_4_ = fVar140 * fVar141;
  auVar299._16_4_ = fVar90 * 0.0;
  auVar299._20_4_ = fVar140 * 0.0;
  auVar299._24_4_ = fVar90 * 0.0;
  auVar299._28_4_ = auVar18._4_4_;
  auVar94 = vfmadd231ps_fma(auVar299,auVar118,auVar240);
  auVar27._28_4_ = fVar140;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar69._12_4_ * fVar141,
                          CONCAT48(auVar69._8_4_ * fVar142,
                                   CONCAT44(auVar69._4_4_ * fVar91,auVar69._0_4_ * fVar68))));
  auVar282 = vfmadd231ps_fma(auVar27,auVar118,ZEXT1632(auVar282));
  fVar90 = auVar157._4_4_;
  auVar28._28_4_ = fVar90;
  auVar28._0_28_ =
       ZEXT1628(CONCAT412(auVar154._12_4_ * fVar141,
                          CONCAT48(auVar154._8_4_ * fVar142,
                                   CONCAT44(auVar154._4_4_ * fVar91,auVar154._0_4_ * fVar68))));
  auVar101 = vfmadd231ps_fma(auVar28,auVar118,ZEXT1632(auVar101));
  auVar18 = vshufps_avx(auVar168,auVar168,0xaa);
  uVar92 = auVar18._0_8_;
  auVar211._8_8_ = uVar92;
  auVar211._0_8_ = uVar92;
  auVar211._16_8_ = uVar92;
  auVar211._24_8_ = uVar92;
  auVar21 = vshufps_avx(auVar168,auVar168,0xff);
  uVar92 = auVar21._0_8_;
  auVar325._8_8_ = uVar92;
  auVar325._0_8_ = uVar92;
  auVar325._16_8_ = uVar92;
  auVar325._24_8_ = uVar92;
  auVar168 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar17._12_4_ * fVar141,
                                                CONCAT48(auVar17._8_4_ * fVar142,
                                                         CONCAT44(auVar17._4_4_ * fVar91,
                                                                  auVar17._0_4_ * fVar68)))),
                             auVar118,ZEXT1632(auVar69));
  auVar17 = vshufps_avx(auVar266,auVar266,0xaa);
  auVar293 = vshufps_avx(auVar266,auVar266,0xff);
  auVar266 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar141 * auVar94._12_4_,
                                                CONCAT48(fVar142 * auVar94._8_4_,
                                                         CONCAT44(fVar91 * auVar94._4_4_,
                                                                  fVar68 * auVar94._0_4_)))),
                             auVar118,ZEXT1632(auVar154));
  auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar141 * auVar168._12_4_,
                                               CONCAT48(fVar142 * auVar168._8_4_,
                                                        CONCAT44(fVar91 * auVar168._4_4_,
                                                                 fVar68 * auVar168._0_4_)))),
                            auVar118,ZEXT1632(auVar282));
  auVar22 = vsubps_avx(ZEXT1632(auVar168),ZEXT1632(auVar282));
  auVar168 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar141 * auVar266._12_4_,
                                                CONCAT48(fVar142 * auVar266._8_4_,
                                                         CONCAT44(fVar91 * auVar266._4_4_,
                                                                  fVar68 * auVar266._0_4_)))),
                             auVar118,ZEXT1632(auVar101));
  auVar23 = vsubps_avx(ZEXT1632(auVar266),ZEXT1632(auVar101));
  fVar140 = auVar23._28_4_;
  auVar298._0_4_ = fStack_140 * auVar22._0_4_ * 3.0;
  auVar298._4_4_ = fStack_140 * auVar22._4_4_ * 3.0;
  auVar298._8_4_ = fStack_140 * auVar22._8_4_ * 3.0;
  auVar298._12_4_ = fStack_140 * auVar22._12_4_ * 3.0;
  auVar298._16_4_ = fStack_140 * auVar22._16_4_ * 3.0;
  auVar298._20_4_ = fStack_140 * auVar22._20_4_ * 3.0;
  auVar298._24_4_ = fStack_140 * auVar22._24_4_ * 3.0;
  auVar298._28_4_ = 0;
  local_3c8._0_4_ = fStack_140 * auVar23._0_4_ * 3.0;
  local_3c8._4_4_ = fStack_140 * auVar23._4_4_ * 3.0;
  fStack_3c0 = fStack_140 * auVar23._8_4_ * 3.0;
  fStack_3bc = fStack_140 * auVar23._12_4_ * 3.0;
  fStack_3b8 = fStack_140 * auVar23._16_4_ * 3.0;
  fStack_3b4 = fStack_140 * auVar23._20_4_ * 3.0;
  fStack_3b0 = fStack_140 * auVar23._24_4_ * 3.0;
  fStack_3ac = fVar140;
  fVar139 = auVar19._0_4_;
  fVar163 = auVar19._4_4_;
  auVar29._4_4_ = fVar163 * fVar91;
  auVar29._0_4_ = fVar139 * fVar68;
  auVar29._8_4_ = fVar139 * fVar142;
  auVar29._12_4_ = fVar163 * fVar141;
  auVar29._16_4_ = fVar139 * 0.0;
  auVar29._20_4_ = fVar163 * 0.0;
  auVar29._24_4_ = fVar139 * 0.0;
  auVar29._28_4_ = fVar140;
  auVar19 = vfmadd231ps_fma(auVar29,auVar118,_local_458);
  fVar139 = auVar157._0_4_;
  auVar30._4_4_ = fVar90 * fVar91;
  auVar30._0_4_ = fVar139 * fVar68;
  auVar30._8_4_ = fVar139 * fVar142;
  auVar30._12_4_ = fVar90 * fVar141;
  auVar30._16_4_ = fVar139 * 0.0;
  auVar30._20_4_ = fVar90 * 0.0;
  auVar30._24_4_ = fVar139 * 0.0;
  auVar30._28_4_ = 0;
  auVar157 = vfmadd231ps_fma(auVar30,auVar118,_local_538);
  fVar90 = auVar18._0_4_;
  fVar139 = auVar18._4_4_;
  auVar31._4_4_ = fVar139 * fVar91;
  auVar31._0_4_ = fVar90 * fVar68;
  auVar31._8_4_ = fVar90 * fVar142;
  auVar31._12_4_ = fVar139 * fVar141;
  auVar31._16_4_ = fVar90 * 0.0;
  auVar31._20_4_ = fVar139 * 0.0;
  auVar31._24_4_ = fVar90 * 0.0;
  auVar31._28_4_ = auVar22._28_4_;
  auVar18 = vfmadd231ps_fma(auVar31,auVar118,auVar225);
  fVar90 = auVar21._0_4_;
  fVar164 = auVar21._4_4_;
  auVar32._4_4_ = fVar164 * fVar91;
  auVar32._0_4_ = fVar90 * fVar68;
  auVar32._8_4_ = fVar90 * fVar142;
  auVar32._12_4_ = fVar164 * fVar141;
  auVar32._16_4_ = fVar90 * 0.0;
  auVar32._20_4_ = fVar164 * 0.0;
  auVar32._24_4_ = fVar90 * 0.0;
  auVar32._28_4_ = fVar163;
  auVar21 = vfmadd231ps_fma(auVar32,auVar118,local_408);
  local_408 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar69));
  fVar90 = auVar17._0_4_;
  fVar139 = auVar17._4_4_;
  auVar33._4_4_ = fVar139 * fVar91;
  auVar33._0_4_ = fVar90 * fVar68;
  auVar33._8_4_ = fVar90 * fVar142;
  auVar33._12_4_ = fVar139 * fVar141;
  auVar33._16_4_ = fVar90 * 0.0;
  auVar33._20_4_ = fVar139 * 0.0;
  auVar33._24_4_ = fVar90 * 0.0;
  auVar33._28_4_ = fVar139;
  auVar17 = vfmadd231ps_fma(auVar33,auVar118,auVar211);
  auVar25 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar168));
  fVar90 = auVar293._0_4_;
  fVar139 = auVar293._4_4_;
  auVar34._4_4_ = fVar139 * fVar91;
  auVar34._0_4_ = fVar90 * fVar68;
  auVar34._8_4_ = fVar90 * fVar142;
  auVar34._12_4_ = fVar139 * fVar141;
  auVar34._16_4_ = fVar90 * 0.0;
  auVar34._20_4_ = fVar139 * 0.0;
  auVar34._24_4_ = fVar90 * 0.0;
  auVar34._28_4_ = fVar139;
  auVar293 = vfmadd231ps_fma(auVar34,auVar118,auVar325);
  auVar35._28_4_ = fVar164;
  auVar35._0_28_ =
       ZEXT1628(CONCAT412(auVar18._12_4_ * fVar141,
                          CONCAT48(auVar18._8_4_ * fVar142,
                                   CONCAT44(auVar18._4_4_ * fVar91,auVar18._0_4_ * fVar68))));
  auVar19 = vfmadd231ps_fma(auVar35,auVar118,ZEXT1632(auVar19));
  auVar157 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar141 * auVar21._12_4_,
                                                CONCAT48(fVar142 * auVar21._8_4_,
                                                         CONCAT44(fVar91 * auVar21._4_4_,
                                                                  fVar68 * auVar21._0_4_)))),
                             auVar118,ZEXT1632(auVar157));
  local_458._0_4_ = auVar69._0_4_ + auVar298._0_4_;
  local_458._4_4_ = auVar69._4_4_ + auVar298._4_4_;
  uStack_450._0_4_ = auVar69._8_4_ + auVar298._8_4_;
  uStack_450._4_4_ = auVar69._12_4_ + auVar298._12_4_;
  register0x00001250 = auVar298._16_4_ + 0.0;
  register0x00001254 = auVar298._20_4_ + 0.0;
  register0x00001258 = auVar298._24_4_ + 0.0;
  register0x0000125c = 0;
  auVar18 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar17._12_4_ * fVar141,
                                               CONCAT48(auVar17._8_4_ * fVar142,
                                                        CONCAT44(auVar17._4_4_ * fVar91,
                                                                 auVar17._0_4_ * fVar68)))),auVar118
                            ,ZEXT1632(auVar18));
  auVar21 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar293._12_4_ * fVar141,
                                               CONCAT48(auVar293._8_4_ * fVar142,
                                                        CONCAT44(auVar293._4_4_ * fVar91,
                                                                 auVar293._0_4_ * fVar68)))),
                            auVar118,ZEXT1632(auVar21));
  auVar17 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar141 * auVar18._12_4_,
                                               CONCAT48(fVar142 * auVar18._8_4_,
                                                        CONCAT44(fVar91 * auVar18._4_4_,
                                                                 fVar68 * auVar18._0_4_)))),auVar118
                            ,ZEXT1632(auVar19));
  auVar293 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar21._12_4_ * fVar141,
                                                CONCAT48(auVar21._8_4_ * fVar142,
                                                         CONCAT44(auVar21._4_4_ * fVar91,
                                                                  auVar21._0_4_ * fVar68)))),
                             ZEXT1632(auVar157),auVar118);
  auVar118 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
  auVar22 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar157));
  auVar319._0_4_ = fStack_140 * auVar118._0_4_ * 3.0;
  auVar319._4_4_ = fStack_140 * auVar118._4_4_ * 3.0;
  auVar319._8_4_ = fStack_140 * auVar118._8_4_ * 3.0;
  auVar319._12_4_ = fStack_140 * auVar118._12_4_ * 3.0;
  auVar319._16_4_ = fStack_140 * auVar118._16_4_ * 3.0;
  auVar319._20_4_ = fStack_140 * auVar118._20_4_ * 3.0;
  auVar319._24_4_ = fStack_140 * auVar118._24_4_ * 3.0;
  auVar319._28_4_ = 0;
  local_158 = fStack_140 * auVar22._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar22._4_4_ * 3.0;
  auVar36._4_4_ = fStack_154;
  auVar36._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar22._8_4_ * 3.0;
  auVar36._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar22._12_4_ * 3.0;
  auVar36._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar22._16_4_ * 3.0;
  auVar36._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar22._20_4_ * 3.0;
  auVar36._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar22._24_4_ * 3.0;
  auVar36._24_4_ = fStack_140;
  auVar36._28_4_ = 0x40400000;
  _local_428 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar17));
  _local_3a8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar293));
  auVar118 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar69));
  auVar22 = vsubps_avx(ZEXT1632(auVar293),ZEXT1632(auVar168));
  auVar23 = vsubps_avx(_local_428,local_408);
  fVar165 = auVar118._0_4_ + auVar23._0_4_;
  fVar228 = auVar118._4_4_ + auVar23._4_4_;
  fVar230 = auVar118._8_4_ + auVar23._8_4_;
  fVar232 = auVar118._12_4_ + auVar23._12_4_;
  fVar233 = auVar118._16_4_ + auVar23._16_4_;
  fVar212 = auVar118._20_4_ + auVar23._20_4_;
  fVar227 = auVar118._24_4_ + auVar23._24_4_;
  auVar24 = vsubps_avx(_local_3a8,auVar25);
  auVar88._0_4_ = auVar22._0_4_ + auVar24._0_4_;
  auVar88._4_4_ = auVar22._4_4_ + auVar24._4_4_;
  auVar88._8_4_ = auVar22._8_4_ + auVar24._8_4_;
  auVar88._12_4_ = auVar22._12_4_ + auVar24._12_4_;
  auVar88._16_4_ = auVar22._16_4_ + auVar24._16_4_;
  auVar88._20_4_ = auVar22._20_4_ + auVar24._20_4_;
  auVar88._24_4_ = auVar22._24_4_ + auVar24._24_4_;
  auVar88._28_4_ = auVar22._28_4_ + auVar24._28_4_;
  local_f8 = ZEXT1632(auVar168);
  fVar68 = auVar168._0_4_;
  local_178 = (float)local_3c8._0_4_ + fVar68;
  fVar91 = auVar168._4_4_;
  fStack_174 = (float)local_3c8._4_4_ + fVar91;
  fVar142 = auVar168._8_4_;
  fStack_170 = fStack_3c0 + fVar142;
  fVar141 = auVar168._12_4_;
  fStack_16c = fStack_3bc + fVar141;
  fStack_168 = fStack_3b8 + 0.0;
  fStack_164 = fStack_3b4 + 0.0;
  fStack_160 = fStack_3b0 + 0.0;
  local_b8 = ZEXT1632(auVar69);
  auVar22 = vsubps_avx(local_b8,auVar298);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar22);
  auVar22 = vsubps_avx(local_f8,_local_3c8);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar22);
  local_118._0_4_ = auVar17._0_4_ + auVar319._0_4_;
  local_118._4_4_ = auVar17._4_4_ + auVar319._4_4_;
  local_118._8_4_ = auVar17._8_4_ + auVar319._8_4_;
  local_118._12_4_ = auVar17._12_4_ + auVar319._12_4_;
  local_118._16_4_ = auVar319._16_4_ + 0.0;
  local_118._20_4_ = auVar319._20_4_ + 0.0;
  local_118._24_4_ = auVar319._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar299 = ZEXT1632(auVar17);
  auVar22 = vsubps_avx(auVar299,auVar319);
  _local_3c8 = vpermps_avx2(_DAT_01fb7720,auVar22);
  fVar90 = auVar293._0_4_;
  local_158 = fVar90 + local_158;
  fVar139 = auVar293._4_4_;
  fStack_154 = fVar139 + fStack_154;
  fVar163 = auVar293._8_4_;
  fStack_150 = fVar163 + fStack_150;
  fVar164 = auVar293._12_4_;
  fStack_14c = fVar164 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar22 = vsubps_avx(ZEXT1632(auVar293),auVar36);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar22);
  auVar37._4_4_ = fVar91 * fVar228;
  auVar37._0_4_ = fVar68 * fVar165;
  auVar37._8_4_ = fVar142 * fVar230;
  auVar37._12_4_ = fVar141 * fVar232;
  auVar37._16_4_ = fVar233 * 0.0;
  auVar37._20_4_ = fVar212 * 0.0;
  auVar37._24_4_ = fVar227 * 0.0;
  auVar37._28_4_ = auVar22._28_4_;
  auVar18 = vfnmadd231ps_fma(auVar37,local_b8,auVar88);
  fStack_15c = fVar140 + 0.0;
  auVar38._4_4_ = fStack_174 * fVar228;
  auVar38._0_4_ = local_178 * fVar165;
  auVar38._8_4_ = fStack_170 * fVar230;
  auVar38._12_4_ = fStack_16c * fVar232;
  auVar38._16_4_ = fStack_168 * fVar233;
  auVar38._20_4_ = fStack_164 * fVar212;
  auVar38._24_4_ = fStack_160 * fVar227;
  auVar38._28_4_ = 0;
  auVar19 = vfnmadd231ps_fma(auVar38,auVar88,_local_458);
  auVar39._4_4_ = local_198._4_4_ * fVar228;
  auVar39._0_4_ = local_198._0_4_ * fVar165;
  auVar39._8_4_ = local_198._8_4_ * fVar230;
  auVar39._12_4_ = local_198._12_4_ * fVar232;
  auVar39._16_4_ = local_198._16_4_ * fVar233;
  auVar39._20_4_ = local_198._20_4_ * fVar212;
  auVar39._24_4_ = local_198._24_4_ * fVar227;
  auVar39._28_4_ = fVar140 + 0.0;
  auVar157 = vfnmadd231ps_fma(auVar39,local_d8,auVar88);
  local_538._0_4_ = auVar25._0_4_;
  local_538._4_4_ = auVar25._4_4_;
  uStack_530._0_4_ = auVar25._8_4_;
  uStack_530._4_4_ = auVar25._12_4_;
  uStack_528._0_4_ = auVar25._16_4_;
  uStack_528._4_4_ = auVar25._20_4_;
  uStack_520._0_4_ = auVar25._24_4_;
  uStack_520._4_4_ = auVar25._28_4_;
  auVar40._4_4_ = (float)local_538._4_4_ * fVar228;
  auVar40._0_4_ = (float)local_538._0_4_ * fVar165;
  auVar40._8_4_ = (float)uStack_530 * fVar230;
  auVar40._12_4_ = uStack_530._4_4_ * fVar232;
  auVar40._16_4_ = (float)uStack_528 * fVar233;
  auVar40._20_4_ = uStack_528._4_4_ * fVar212;
  auVar40._24_4_ = (float)uStack_520 * fVar227;
  auVar40._28_4_ = uStack_520._4_4_;
  auVar21 = vfnmadd231ps_fma(auVar40,local_408,auVar88);
  auVar241._0_4_ = fVar90 * fVar165;
  auVar241._4_4_ = fVar139 * fVar228;
  auVar241._8_4_ = fVar163 * fVar230;
  auVar241._12_4_ = fVar164 * fVar232;
  auVar241._16_4_ = fVar233 * 0.0;
  auVar241._20_4_ = fVar212 * 0.0;
  auVar241._24_4_ = fVar227 * 0.0;
  auVar241._28_4_ = 0;
  auVar17 = vfnmadd231ps_fma(auVar241,auVar299,auVar88);
  uStack_13c = 0x40400000;
  auVar41._4_4_ = fStack_154 * fVar228;
  auVar41._0_4_ = local_158 * fVar165;
  auVar41._8_4_ = fStack_150 * fVar230;
  auVar41._12_4_ = fStack_14c * fVar232;
  auVar41._16_4_ = fStack_148 * fVar233;
  auVar41._20_4_ = fStack_144 * fVar212;
  auVar41._24_4_ = fStack_140 * fVar227;
  auVar41._28_4_ = local_408._28_4_;
  auVar168 = vfnmadd231ps_fma(auVar41,local_118,auVar88);
  auVar42._4_4_ = local_138._4_4_ * fVar228;
  auVar42._0_4_ = local_138._0_4_ * fVar165;
  auVar42._8_4_ = local_138._8_4_ * fVar230;
  auVar42._12_4_ = local_138._12_4_ * fVar232;
  auVar42._16_4_ = local_138._16_4_ * fVar233;
  auVar42._20_4_ = local_138._20_4_ * fVar212;
  auVar42._24_4_ = local_138._24_4_ * fVar227;
  auVar42._28_4_ = local_138._28_4_;
  auVar266 = vfnmadd231ps_fma(auVar42,_local_3c8,auVar88);
  auVar43._4_4_ = local_3a8._4_4_ * fVar228;
  auVar43._0_4_ = local_3a8._0_4_ * fVar165;
  auVar43._8_4_ = local_3a8._8_4_ * fVar230;
  auVar43._12_4_ = local_3a8._12_4_ * fVar232;
  auVar43._16_4_ = local_3a8._16_4_ * fVar233;
  auVar43._20_4_ = local_3a8._20_4_ * fVar212;
  auVar43._24_4_ = local_3a8._24_4_ * fVar227;
  auVar43._28_4_ = auVar118._28_4_ + auVar23._28_4_;
  auVar256 = ZEXT3264(_local_428);
  auVar282 = vfnmadd231ps_fma(auVar43,_local_428,auVar88);
  auVar22 = vminps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
  auVar118 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
  auVar23 = vminps_avx(ZEXT1632(auVar157),ZEXT1632(auVar21));
  auVar23 = vminps_avx(auVar22,auVar23);
  auVar22 = vmaxps_avx(ZEXT1632(auVar157),ZEXT1632(auVar21));
  auVar118 = vmaxps_avx(auVar118,auVar22);
  auVar24 = vminps_avx(ZEXT1632(auVar17),ZEXT1632(auVar168));
  auVar22 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar168));
  auVar16 = vminps_avx(ZEXT1632(auVar266),ZEXT1632(auVar282));
  auVar24 = vminps_avx(auVar24,auVar16);
  auVar24 = vminps_avx(auVar23,auVar24);
  auVar23 = vmaxps_avx(ZEXT1632(auVar266),ZEXT1632(auVar282));
  auVar22 = vmaxps_avx(auVar22,auVar23);
  auVar22 = vmaxps_avx(auVar118,auVar22);
  auVar54._4_4_ = fStack_74;
  auVar54._0_4_ = local_78;
  auVar54._8_4_ = fStack_70;
  auVar54._12_4_ = fStack_6c;
  auVar54._16_4_ = fStack_68;
  auVar54._20_4_ = fStack_64;
  auVar54._24_4_ = fStack_60;
  auVar54._28_4_ = fStack_5c;
  auVar118 = vcmpps_avx(auVar24,auVar54,2);
  auVar53._4_4_ = fStack_94;
  auVar53._0_4_ = local_98;
  auVar53._8_4_ = fStack_90;
  auVar53._12_4_ = fStack_8c;
  auVar53._16_4_ = fStack_88;
  auVar53._20_4_ = fStack_84;
  auVar53._24_4_ = fStack_80;
  auVar53._28_4_ = fStack_7c;
  auVar22 = vcmpps_avx(auVar22,auVar53,5);
  auVar118 = vandps_avx(auVar22,auVar118);
  auVar22 = local_1b8 & auVar118;
  if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0x7f,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar22 >> 0xbf,0) != '\0') ||
      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0') {
    auVar22 = vsubps_avx(local_408,local_b8);
    auVar23 = vsubps_avx(_local_428,auVar299);
    fVar165 = auVar22._0_4_ + auVar23._0_4_;
    fVar228 = auVar22._4_4_ + auVar23._4_4_;
    fVar230 = auVar22._8_4_ + auVar23._8_4_;
    fVar232 = auVar22._12_4_ + auVar23._12_4_;
    fVar233 = auVar22._16_4_ + auVar23._16_4_;
    fVar212 = auVar22._20_4_ + auVar23._20_4_;
    fVar227 = auVar22._24_4_ + auVar23._24_4_;
    auVar24 = vsubps_avx(auVar25,local_f8);
    auVar16 = vsubps_avx(_local_3a8,ZEXT1632(auVar293));
    auVar121._0_4_ = auVar24._0_4_ + auVar16._0_4_;
    auVar121._4_4_ = auVar24._4_4_ + auVar16._4_4_;
    auVar121._8_4_ = auVar24._8_4_ + auVar16._8_4_;
    auVar121._12_4_ = auVar24._12_4_ + auVar16._12_4_;
    auVar121._16_4_ = auVar24._16_4_ + auVar16._16_4_;
    auVar121._20_4_ = auVar24._20_4_ + auVar16._20_4_;
    auVar121._24_4_ = auVar24._24_4_ + auVar16._24_4_;
    fVar140 = auVar16._28_4_;
    auVar121._28_4_ = auVar24._28_4_ + fVar140;
    auVar44._4_4_ = fVar91 * fVar228;
    auVar44._0_4_ = fVar68 * fVar165;
    auVar44._8_4_ = fVar142 * fVar230;
    auVar44._12_4_ = fVar141 * fVar232;
    auVar44._16_4_ = fVar233 * 0.0;
    auVar44._20_4_ = fVar212 * 0.0;
    auVar44._24_4_ = fVar227 * 0.0;
    auVar44._28_4_ = local_3a8._28_4_;
    auVar17 = vfnmadd231ps_fma(auVar44,auVar121,local_b8);
    auVar45._4_4_ = fVar228 * fStack_174;
    auVar45._0_4_ = fVar165 * local_178;
    auVar45._8_4_ = fVar230 * fStack_170;
    auVar45._12_4_ = fVar232 * fStack_16c;
    auVar45._16_4_ = fVar233 * fStack_168;
    auVar45._20_4_ = fVar212 * fStack_164;
    auVar45._24_4_ = fVar227 * fStack_160;
    auVar45._28_4_ = 0;
    auVar18 = vfnmadd213ps_fma(_local_458,auVar121,auVar45);
    auVar46._4_4_ = fVar228 * local_198._4_4_;
    auVar46._0_4_ = fVar165 * local_198._0_4_;
    auVar46._8_4_ = fVar230 * local_198._8_4_;
    auVar46._12_4_ = fVar232 * local_198._12_4_;
    auVar46._16_4_ = fVar233 * local_198._16_4_;
    auVar46._20_4_ = fVar212 * local_198._20_4_;
    auVar46._24_4_ = fVar227 * local_198._24_4_;
    auVar46._28_4_ = 0;
    auVar19 = vfnmadd213ps_fma(local_d8,auVar121,auVar46);
    auVar47._4_4_ = (float)local_538._4_4_ * fVar228;
    auVar47._0_4_ = (float)local_538._0_4_ * fVar165;
    auVar47._8_4_ = (float)uStack_530 * fVar230;
    auVar47._12_4_ = uStack_530._4_4_ * fVar232;
    auVar47._16_4_ = (float)uStack_528 * fVar233;
    auVar47._20_4_ = uStack_528._4_4_ * fVar212;
    auVar47._24_4_ = (float)uStack_520 * fVar227;
    auVar47._28_4_ = 0;
    auVar293 = vfnmadd231ps_fma(auVar47,auVar121,local_408);
    auVar161._0_4_ = fVar90 * fVar165;
    auVar161._4_4_ = fVar139 * fVar228;
    auVar161._8_4_ = fVar163 * fVar230;
    auVar161._12_4_ = fVar164 * fVar232;
    auVar161._16_4_ = fVar233 * 0.0;
    auVar161._20_4_ = fVar212 * 0.0;
    auVar161._24_4_ = fVar227 * 0.0;
    auVar161._28_4_ = 0;
    auVar168 = vfnmadd231ps_fma(auVar161,auVar121,auVar299);
    auVar48._4_4_ = fVar228 * fStack_154;
    auVar48._0_4_ = fVar165 * local_158;
    auVar48._8_4_ = fVar230 * fStack_150;
    auVar48._12_4_ = fVar232 * fStack_14c;
    auVar48._16_4_ = fVar233 * fStack_148;
    auVar48._20_4_ = fVar212 * fStack_144;
    auVar48._24_4_ = fVar227 * fStack_140;
    auVar48._28_4_ = fVar140;
    auVar157 = vfnmadd213ps_fma(local_118,auVar121,auVar48);
    auVar49._4_4_ = fVar228 * local_138._4_4_;
    auVar49._0_4_ = fVar165 * local_138._0_4_;
    auVar49._8_4_ = fVar230 * local_138._8_4_;
    auVar49._12_4_ = fVar232 * local_138._12_4_;
    auVar49._16_4_ = fVar233 * local_138._16_4_;
    auVar49._20_4_ = fVar212 * local_138._20_4_;
    auVar49._24_4_ = fVar227 * local_138._24_4_;
    auVar49._28_4_ = fVar140;
    auVar21 = vfnmadd213ps_fma(_local_3c8,auVar121,auVar49);
    auVar256 = ZEXT1664(auVar21);
    auVar50._4_4_ = fVar228 * local_3a8._4_4_;
    auVar50._0_4_ = fVar165 * local_3a8._0_4_;
    auVar50._8_4_ = fVar230 * local_3a8._8_4_;
    auVar50._12_4_ = fVar232 * local_3a8._12_4_;
    auVar50._16_4_ = fVar233 * local_3a8._16_4_;
    auVar50._20_4_ = fVar212 * local_3a8._20_4_;
    auVar50._24_4_ = fVar227 * local_3a8._24_4_;
    auVar50._28_4_ = auVar22._28_4_ + auVar23._28_4_;
    auVar266 = vfnmadd231ps_fma(auVar50,auVar121,_local_428);
    auVar23 = vminps_avx(ZEXT1632(auVar17),ZEXT1632(auVar18));
    auVar22 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar18));
    auVar24 = vminps_avx(ZEXT1632(auVar19),ZEXT1632(auVar293));
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar293));
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar16 = vminps_avx(ZEXT1632(auVar168),ZEXT1632(auVar157));
    auVar23 = vmaxps_avx(ZEXT1632(auVar168),ZEXT1632(auVar157));
    auVar25 = vminps_avx(ZEXT1632(auVar21),ZEXT1632(auVar266));
    auVar16 = vminps_avx(auVar16,auVar25);
    auVar16 = vminps_avx(auVar24,auVar16);
    auVar24 = vmaxps_avx(ZEXT1632(auVar21),ZEXT1632(auVar266));
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vcmpps_avx(auVar16,auVar54,2);
    auVar23 = vcmpps_avx(auVar23,auVar53,5);
    auVar22 = vandps_avx(auVar23,auVar22);
    auVar118 = vandps_avx(auVar118,local_1b8);
    auVar23 = auVar118 & auVar22;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar118 = vandps_avx(auVar22,auVar118);
      uVar63 = vmovmskps_avx(auVar118);
      if (uVar63 != 0) {
        auStack_2a8[uVar58] = uVar63 & 0xff;
        uVar92 = vmovlps_avx(local_218);
        *(undefined8 *)(&uStack_1d8 + uVar58 * 2) = uVar92;
        uVar62 = vmovlps_avx(auVar75);
        auStack_58[uVar58] = uVar62;
        uVar58 = (ulong)((int)uVar58 + 1);
      }
    }
  }
LAB_0123879e:
  if ((int)uVar58 != 0) {
    uVar56 = (int)uVar58 - 1;
    uVar59 = (ulong)uVar56;
    uVar61 = auStack_2a8[uVar59];
    uVar63 = (&uStack_1d8)[uVar59 * 2];
    fVar68 = afStack_1d4[uVar59 * 2];
    iVar26 = 0;
    for (uVar62 = (ulong)uVar61; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      iVar26 = iVar26 + 1;
    }
    uVar61 = uVar61 - 1 & uVar61;
    if (uVar61 == 0) {
      uVar58 = (ulong)uVar56;
    }
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auStack_58[uVar59];
    auStack_2a8[uVar59] = uVar61;
    fVar91 = (float)(iVar26 + 1) * 0.14285715;
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * (float)iVar26 * 0.14285715)),ZEXT416(uVar63),
                              ZEXT416((uint)(1.0 - (float)iVar26 * 0.14285715)));
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar91)),ZEXT416(uVar63),
                              ZEXT416((uint)(1.0 - fVar91)));
    fVar91 = auVar19._0_4_;
    auVar226._0_4_ = auVar18._0_4_;
    fVar68 = fVar91 - auVar226._0_4_;
    if (fVar68 < 0.16666667) {
      auVar157 = vshufps_avx(auVar75,auVar75,0x50);
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar21 = vsubps_avx(auVar109,auVar157);
      fVar142 = auVar157._0_4_;
      auVar177._0_4_ = fVar142 * (float)local_4a8._0_4_;
      fVar141 = auVar157._4_4_;
      auVar177._4_4_ = fVar141 * (float)local_4a8._4_4_;
      fVar90 = auVar157._8_4_;
      auVar177._8_4_ = fVar90 * fStack_4a0;
      fVar140 = auVar157._12_4_;
      auVar177._12_4_ = fVar140 * fStack_49c;
      auVar188._0_4_ = fVar142 * (float)local_4b8._0_4_;
      auVar188._4_4_ = fVar141 * (float)local_4b8._4_4_;
      auVar188._8_4_ = fVar90 * fStack_4b0;
      auVar188._12_4_ = fVar140 * fStack_4ac;
      auVar208._0_4_ = fVar142 * (float)local_4c8._0_4_;
      auVar208._4_4_ = fVar141 * (float)local_4c8._4_4_;
      auVar208._8_4_ = fVar90 * fStack_4c0;
      auVar208._12_4_ = fVar140 * fStack_4bc;
      auVar77._0_4_ = fVar142 * (float)local_4d8._0_4_;
      auVar77._4_4_ = fVar141 * (float)local_4d8._4_4_;
      auVar77._8_4_ = fVar90 * fStack_4d0;
      auVar77._12_4_ = fVar140 * fStack_4cc;
      auVar157 = vfmadd231ps_fma(auVar177,auVar21,local_468);
      auVar17 = vfmadd231ps_fma(auVar188,auVar21,local_478);
      auVar293 = vfmadd231ps_fma(auVar208,auVar21,local_488);
      auVar21 = vfmadd231ps_fma(auVar77,auVar21,local_498);
      auVar162._16_16_ = auVar157;
      auVar162._0_16_ = auVar157;
      auVar182._16_16_ = auVar17;
      auVar182._0_16_ = auVar17;
      auVar196._16_16_ = auVar293;
      auVar196._0_16_ = auVar293;
      auVar226._4_4_ = auVar226._0_4_;
      auVar226._8_4_ = auVar226._0_4_;
      auVar226._12_4_ = auVar226._0_4_;
      auVar226._20_4_ = fVar91;
      auVar226._16_4_ = fVar91;
      auVar226._24_4_ = fVar91;
      auVar226._28_4_ = fVar91;
      auVar118 = vsubps_avx(auVar182,auVar162);
      auVar17 = vfmadd213ps_fma(auVar118,auVar226,auVar162);
      auVar118 = vsubps_avx(auVar196,auVar182);
      auVar168 = vfmadd213ps_fma(auVar118,auVar226,auVar182);
      auVar157 = vsubps_avx(auVar21,auVar293);
      auVar89._16_16_ = auVar157;
      auVar89._0_16_ = auVar157;
      auVar157 = vfmadd213ps_fma(auVar89,auVar226,auVar196);
      auVar118 = vsubps_avx(ZEXT1632(auVar168),ZEXT1632(auVar17));
      auVar21 = vfmadd213ps_fma(auVar118,auVar226,ZEXT1632(auVar17));
      auVar118 = vsubps_avx(ZEXT1632(auVar157),ZEXT1632(auVar168));
      auVar157 = vfmadd213ps_fma(auVar118,auVar226,ZEXT1632(auVar168));
      auVar118 = vsubps_avx(ZEXT1632(auVar157),ZEXT1632(auVar21));
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar118,auVar226);
      fVar163 = auVar118._4_4_ * 3.0;
      local_408._0_4_ = fVar68;
      fVar142 = fVar68 * 0.33333334;
      auVar218._0_8_ =
           CONCAT44(auVar101._4_4_ + fVar142 * fVar163,
                    auVar101._0_4_ + fVar142 * auVar118._0_4_ * 3.0);
      auVar218._8_4_ = auVar101._8_4_ + fVar142 * auVar118._8_4_ * 3.0;
      auVar218._12_4_ = auVar101._12_4_ + fVar142 * auVar118._12_4_ * 3.0;
      auVar21 = vshufpd_avx(auVar101,auVar101,3);
      auVar17 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_3a8 = auVar21;
      auVar157 = vsubps_avx(auVar21,auVar101);
      _local_428 = auVar17;
      auVar293 = vsubps_avx(auVar17,(undefined1  [16])0x0);
      auVar78._0_4_ = auVar157._0_4_ + auVar293._0_4_;
      auVar78._4_4_ = auVar157._4_4_ + auVar293._4_4_;
      auVar78._8_4_ = auVar157._8_4_ + auVar293._8_4_;
      auVar78._12_4_ = auVar157._12_4_ + auVar293._12_4_;
      auVar157 = vshufps_avx(auVar101,auVar101,0xb1);
      auVar293 = vshufps_avx(auVar218,auVar218,0xb1);
      auVar315._4_4_ = auVar78._0_4_;
      auVar315._0_4_ = auVar78._0_4_;
      auVar315._8_4_ = auVar78._0_4_;
      auVar315._12_4_ = auVar78._0_4_;
      auVar168 = vshufps_avx(auVar78,auVar78,0x55);
      fVar141 = auVar168._0_4_;
      auVar79._0_4_ = fVar141 * auVar157._0_4_;
      fVar90 = auVar168._4_4_;
      auVar79._4_4_ = fVar90 * auVar157._4_4_;
      fVar140 = auVar168._8_4_;
      auVar79._8_4_ = fVar140 * auVar157._8_4_;
      fVar139 = auVar168._12_4_;
      auVar79._12_4_ = fVar139 * auVar157._12_4_;
      auVar189._0_4_ = fVar141 * auVar293._0_4_;
      auVar189._4_4_ = fVar90 * auVar293._4_4_;
      auVar189._8_4_ = fVar140 * auVar293._8_4_;
      auVar189._12_4_ = fVar139 * auVar293._12_4_;
      auVar266 = vfmadd231ps_fma(auVar79,auVar315,auVar101);
      _local_3c8 = auVar218;
      auVar282 = vfmadd231ps_fma(auVar189,auVar315,auVar218);
      auVar293 = vshufps_avx(auVar266,auVar266,0xe8);
      auVar168 = vshufps_avx(auVar282,auVar282,0xe8);
      auVar157 = vcmpps_avx(auVar293,auVar168,1);
      uVar63 = vextractps_avx(auVar157,0);
      auVar69 = auVar282;
      if ((uVar63 & 1) == 0) {
        auVar69 = auVar266;
      }
      _local_458 = auVar19;
      auVar153._0_4_ = fVar142 * auVar118._16_4_ * 3.0;
      auVar153._4_4_ = fVar142 * fVar163;
      auVar153._8_4_ = fVar142 * auVar118._24_4_ * 3.0;
      auVar153._12_4_ = fVar142 * auVar256._28_4_;
      auVar122 = vsubps_avx((undefined1  [16])0x0,auVar153);
      auVar154 = vshufps_avx(auVar122,auVar122,0xb1);
      auVar94 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar219._0_4_ = fVar141 * auVar154._0_4_;
      auVar219._4_4_ = fVar90 * auVar154._4_4_;
      auVar219._8_4_ = fVar140 * auVar154._8_4_;
      auVar219._12_4_ = fVar139 * auVar154._12_4_;
      auVar237._0_4_ = auVar94._0_4_ * fVar141;
      auVar237._4_4_ = auVar94._4_4_ * fVar90;
      auVar237._8_4_ = auVar94._8_4_ * fVar140;
      auVar237._12_4_ = auVar94._12_4_ * fVar139;
      auVar123 = vfmadd231ps_fma(auVar219,auVar315,auVar122);
      auVar93 = vfmadd231ps_fma(auVar237,(undefined1  [16])0x0,auVar315);
      auVar94 = vshufps_avx(auVar123,auVar123,0xe8);
      auVar95 = vshufps_avx(auVar93,auVar93,0xe8);
      auVar256 = ZEXT1664(auVar95);
      auVar154 = vcmpps_avx(auVar94,auVar95,1);
      uVar63 = vextractps_avx(auVar154,0);
      auVar143 = auVar93;
      if ((uVar63 & 1) == 0) {
        auVar143 = auVar123;
      }
      auVar69 = vmaxss_avx(auVar143,auVar69);
      auVar293 = vminps_avx(auVar293,auVar168);
      auVar168 = vminps_avx(auVar94,auVar95);
      auVar168 = vminps_avx(auVar293,auVar168);
      auVar157 = vshufps_avx(auVar157,auVar157,0x55);
      auVar157 = vblendps_avx(auVar157,auVar154,2);
      auVar154 = vpslld_avx(auVar157,0x1f);
      auVar157 = vshufpd_avx(auVar282,auVar282,1);
      auVar157 = vinsertps_avx(auVar157,auVar93,0x9c);
      auVar293 = vshufpd_avx(auVar266,auVar266,1);
      auVar293 = vinsertps_avx(auVar293,auVar123,0x9c);
      auVar157 = vblendvps_avx(auVar293,auVar157,auVar154);
      auVar293 = vmovshdup_avx(auVar157);
      auVar157 = vmaxss_avx(auVar293,auVar157);
      fVar140 = auVar168._0_4_;
      auVar293 = vmovshdup_avx(auVar168);
      fVar90 = auVar157._0_4_;
      fVar142 = auVar293._0_4_;
      fVar141 = auVar69._0_4_;
      if (((0.0001 <= fVar140) || (fVar90 <= -0.0001)) && (0.0001 <= fVar142 || fVar90 <= -0.0001))
      goto code_r0x01238aa9;
      goto LAB_01238acf;
    }
    local_218 = vinsertps_avx(auVar18,auVar19,0x10);
    goto LAB_012381ed;
  }
  if (bVar66) goto LAB_012395a4;
  fVar68 = ray->tfar;
  auVar87._4_4_ = fVar68;
  auVar87._0_4_ = fVar68;
  auVar87._8_4_ = fVar68;
  auVar87._12_4_ = fVar68;
  auVar18 = vcmpps_avx(local_228,auVar87,2);
  uVar63 = vmovmskps_avx(auVar18);
  uVar57 = (ulong)((uint)uVar57 & (uint)uVar57 + 0xf & uVar63);
  goto LAB_01237585;
code_r0x01238aa9:
  auVar293 = vcmpps_avx(auVar293,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar266 = vcmpps_avx(auVar168,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar293 = vandps_avx(auVar266,auVar293);
  if (fVar141 <= -0.0001 || (auVar293 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0123879e;
LAB_01238acf:
  auVar266 = vcmpps_avx(auVar168,_DAT_01f45a50,1);
  auVar282 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar293 = vcmpss_avx(auVar69,ZEXT816(0) << 0x20,1);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = 0x3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar131._8_4_ = 0xbf800000;
  auVar131._0_8_ = 0xbf800000bf800000;
  auVar131._12_4_ = 0xbf800000;
  auVar293 = vblendvps_avx(auVar110,auVar131,auVar293);
  auVar266 = vblendvps_avx(auVar110,auVar131,auVar266);
  fVar163 = auVar266._0_4_;
  fVar139 = auVar293._0_4_;
  auVar293 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar163 == fVar139) && (!NAN(fVar163) && !NAN(fVar139))) {
    auVar293 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar163 == fVar139) && (!NAN(fVar163) && !NAN(fVar139))) {
    auVar282 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar266 = vmovshdup_avx(auVar266);
  fVar164 = auVar266._0_4_;
  if ((fVar163 != fVar164) || (NAN(fVar163) || NAN(fVar164))) {
    if ((fVar142 != fVar140) || (NAN(fVar142) || NAN(fVar140))) {
      auVar155._0_4_ = (float)((uint)fVar140 ^ local_2c8);
      auVar155._4_4_ = auVar168._4_4_ ^ uStack_2c4;
      auVar155._8_4_ = auVar168._8_4_ ^ uStack_2c0;
      auVar155._12_4_ = auVar168._12_4_ ^ uStack_2bc;
      auVar156._0_4_ = auVar155._0_4_ / (fVar142 - fVar140);
      auVar156._4_12_ = auVar155._4_12_;
      auVar168 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar156._0_4_)),auVar156,ZEXT416(0));
      auVar266 = auVar168;
    }
    else {
      auVar168 = ZEXT816(0) << 0x20;
      if ((fVar140 != 0.0) || (auVar266 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar140))) {
        auVar168 = SUB6416(ZEXT464(0x7f800000),0);
        auVar266 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar293 = vminss_avx(auVar293,auVar168);
    auVar282 = vmaxss_avx(auVar266,auVar282);
  }
  auVar157 = vcmpss_avx(auVar157,ZEXT416(0),1);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = 0x3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar132._8_4_ = 0xbf800000;
  auVar132._0_8_ = 0xbf800000bf800000;
  auVar132._12_4_ = 0xbf800000;
  auVar157 = vblendvps_avx(auVar111,auVar132,auVar157);
  fVar142 = auVar157._0_4_;
  if ((fVar139 != fVar142) || (NAN(fVar139) || NAN(fVar142))) {
    if ((fVar90 != fVar141) || (NAN(fVar90) || NAN(fVar141))) {
      auVar80._0_4_ = (float)((uint)fVar141 ^ local_2c8);
      auVar80._4_4_ = auVar69._4_4_ ^ uStack_2c4;
      auVar80._8_4_ = auVar69._8_4_ ^ uStack_2c0;
      auVar80._12_4_ = auVar69._12_4_ ^ uStack_2bc;
      auVar158._0_4_ = auVar80._0_4_ / (fVar90 - fVar141);
      auVar158._4_12_ = auVar80._4_12_;
      auVar157 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar158._0_4_)),auVar158,ZEXT416(0));
      auVar168 = auVar157;
    }
    else {
      auVar157 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar141 != 0.0) || (auVar168 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar141))) {
        auVar157 = SUB6416(ZEXT464(0xff800000),0);
        auVar168 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar293 = vminss_avx(auVar293,auVar168);
    auVar282 = vmaxss_avx(auVar157,auVar282);
  }
  if ((fVar164 != fVar142) || (NAN(fVar164) || NAN(fVar142))) {
    auVar293 = vminss_avx(auVar293,SUB6416(ZEXT464(0x3f800000),0));
    auVar282 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar282);
  }
  auVar157 = vmaxss_avx(ZEXT816(0) << 0x40,auVar293);
  auVar293 = vminss_avx(auVar282,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar293._0_4_ < auVar157._0_4_) goto LAB_0123879e;
  auVar157 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar157._0_4_ + -0.1)));
  auVar293 = vminss_avx(ZEXT416((uint)(auVar293._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar178._0_8_ = auVar101._0_8_;
  auVar178._8_8_ = auVar178._0_8_;
  auVar248._8_8_ = auVar218._0_8_;
  auVar248._0_8_ = auVar218._0_8_;
  auVar267._8_8_ = auVar122._0_8_;
  auVar267._0_8_ = auVar122._0_8_;
  auVar168 = vshufpd_avx(auVar218,auVar218,3);
  auVar266 = vshufpd_avx(auVar122,auVar122,3);
  auVar282 = vshufps_avx(auVar157,auVar293,0);
  auVar81._8_4_ = 0x3f800000;
  auVar81._0_8_ = 0x3f8000003f800000;
  auVar81._12_4_ = 0x3f800000;
  auVar101 = vsubps_avx(auVar81,auVar282);
  local_3a8._0_4_ = auVar21._0_4_;
  local_3a8._4_4_ = auVar21._4_4_;
  fStack_3a0 = auVar21._8_4_;
  fStack_39c = auVar21._12_4_;
  fVar142 = auVar282._0_4_;
  auVar82._0_4_ = fVar142 * (float)local_3a8._0_4_;
  fVar141 = auVar282._4_4_;
  auVar82._4_4_ = fVar141 * (float)local_3a8._4_4_;
  fVar90 = auVar282._8_4_;
  auVar82._8_4_ = fVar90 * fStack_3a0;
  fVar140 = auVar282._12_4_;
  auVar82._12_4_ = fVar140 * fStack_39c;
  auVar209._0_4_ = fVar142 * auVar168._0_4_;
  auVar209._4_4_ = fVar141 * auVar168._4_4_;
  auVar209._8_4_ = fVar90 * auVar168._8_4_;
  auVar209._12_4_ = fVar140 * auVar168._12_4_;
  auVar220._0_4_ = fVar142 * auVar266._0_4_;
  auVar220._4_4_ = fVar141 * auVar266._4_4_;
  auVar220._8_4_ = fVar90 * auVar266._8_4_;
  auVar220._12_4_ = fVar140 * auVar266._12_4_;
  local_428._0_4_ = auVar17._0_4_;
  local_428._4_4_ = auVar17._4_4_;
  fStack_420 = auVar17._8_4_;
  fStack_41c = auVar17._12_4_;
  auVar238._0_4_ = fVar142 * (float)local_428._0_4_;
  auVar238._4_4_ = fVar141 * (float)local_428._4_4_;
  auVar238._8_4_ = fVar90 * fStack_420;
  auVar238._12_4_ = fVar140 * fStack_41c;
  auVar168 = vfmadd231ps_fma(auVar82,auVar101,auVar178);
  auVar266 = vfmadd231ps_fma(auVar209,auVar101,auVar248);
  auVar282 = vfmadd231ps_fma(auVar220,auVar101,auVar267);
  auVar101 = vfmadd231ps_fma(auVar238,auVar101,ZEXT816(0));
  auVar21 = vmovshdup_avx(auVar75);
  auVar122 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * auVar157._0_4_)),auVar75,
                             ZEXT416((uint)(1.0 - auVar157._0_4_)));
  auVar123 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * auVar293._0_4_)),auVar75,
                             ZEXT416((uint)(1.0 - auVar293._0_4_)));
  fVar142 = 1.0 / fVar68;
  auVar157 = vsubps_avx(auVar266,auVar168);
  auVar249._0_4_ = auVar157._0_4_ * 3.0;
  auVar249._4_4_ = auVar157._4_4_ * 3.0;
  auVar249._8_4_ = auVar157._8_4_ * 3.0;
  auVar249._12_4_ = auVar157._12_4_ * 3.0;
  auVar157 = vsubps_avx(auVar282,auVar266);
  auVar268._0_4_ = auVar157._0_4_ * 3.0;
  auVar268._4_4_ = auVar157._4_4_ * 3.0;
  auVar268._8_4_ = auVar157._8_4_ * 3.0;
  auVar268._12_4_ = auVar157._12_4_ * 3.0;
  auVar157 = vsubps_avx(auVar101,auVar282);
  auVar283._0_4_ = auVar157._0_4_ * 3.0;
  auVar283._4_4_ = auVar157._4_4_ * 3.0;
  auVar283._8_4_ = auVar157._8_4_ * 3.0;
  auVar283._12_4_ = auVar157._12_4_ * 3.0;
  auVar21 = vminps_avx(auVar268,auVar283);
  auVar157 = vmaxps_avx(auVar268,auVar283);
  auVar21 = vminps_avx(auVar249,auVar21);
  auVar157 = vmaxps_avx(auVar249,auVar157);
  auVar17 = vshufpd_avx(auVar21,auVar21,3);
  auVar293 = vshufpd_avx(auVar157,auVar157,3);
  auVar21 = vminps_avx(auVar21,auVar17);
  auVar157 = vmaxps_avx(auVar157,auVar293);
  auVar269._0_4_ = auVar21._0_4_ * fVar142;
  auVar269._4_4_ = auVar21._4_4_ * fVar142;
  auVar269._8_4_ = auVar21._8_4_ * fVar142;
  auVar269._12_4_ = auVar21._12_4_ * fVar142;
  auVar250._0_4_ = auVar157._0_4_ * fVar142;
  auVar250._4_4_ = auVar157._4_4_ * fVar142;
  auVar250._8_4_ = auVar157._8_4_ * fVar142;
  auVar250._12_4_ = auVar157._12_4_ * fVar142;
  fVar142 = 1.0 / (auVar123._0_4_ - auVar122._0_4_);
  auVar157 = vshufpd_avx(auVar168,auVar168,3);
  auVar21 = vshufpd_avx(auVar266,auVar266,3);
  auVar17 = vshufpd_avx(auVar282,auVar282,3);
  auVar293 = vshufpd_avx(auVar101,auVar101,3);
  auVar157 = vsubps_avx(auVar157,auVar168);
  auVar168 = vsubps_avx(auVar21,auVar266);
  auVar266 = vsubps_avx(auVar17,auVar282);
  auVar293 = vsubps_avx(auVar293,auVar101);
  auVar21 = vminps_avx(auVar157,auVar168);
  auVar157 = vmaxps_avx(auVar157,auVar168);
  auVar17 = vminps_avx(auVar266,auVar293);
  auVar17 = vminps_avx(auVar21,auVar17);
  auVar21 = vmaxps_avx(auVar266,auVar293);
  auVar157 = vmaxps_avx(auVar157,auVar21);
  auVar308._0_4_ = fVar142 * auVar17._0_4_;
  auVar308._4_4_ = fVar142 * auVar17._4_4_;
  auVar308._8_4_ = fVar142 * auVar17._8_4_;
  auVar308._12_4_ = fVar142 * auVar17._12_4_;
  auVar294._0_4_ = fVar142 * auVar157._0_4_;
  auVar294._4_4_ = fVar142 * auVar157._4_4_;
  auVar294._8_4_ = fVar142 * auVar157._8_4_;
  auVar294._12_4_ = fVar142 * auVar157._12_4_;
  auVar293 = vinsertps_avx(auVar18,auVar122,0x10);
  auVar168 = vinsertps_avx(auVar19,auVar123,0x10);
  auVar284._0_4_ = (auVar293._0_4_ + auVar168._0_4_) * 0.5;
  auVar284._4_4_ = (auVar293._4_4_ + auVar168._4_4_) * 0.5;
  auVar284._8_4_ = (auVar293._8_4_ + auVar168._8_4_) * 0.5;
  auVar284._12_4_ = (auVar293._12_4_ + auVar168._12_4_) * 0.5;
  auVar83._4_4_ = auVar284._0_4_;
  auVar83._0_4_ = auVar284._0_4_;
  auVar83._8_4_ = auVar284._0_4_;
  auVar83._12_4_ = auVar284._0_4_;
  auVar157 = vfmadd213ps_fma(local_318,auVar83,local_4e8);
  auVar21 = vfmadd213ps_fma(local_328,auVar83,auVar20);
  auVar17 = vfmadd213ps_fma(local_1e8,auVar83,auVar171);
  auVar19 = vsubps_avx(auVar21,auVar157);
  auVar157 = vfmadd213ps_fma(auVar19,auVar83,auVar157);
  auVar19 = vsubps_avx(auVar17,auVar21);
  auVar19 = vfmadd213ps_fma(auVar19,auVar83,auVar21);
  auVar19 = vsubps_avx(auVar19,auVar157);
  auVar157 = vfmadd231ps_fma(auVar157,auVar19,auVar83);
  auVar84._0_8_ = CONCAT44(auVar19._4_4_ * 3.0,auVar19._0_4_ * 3.0);
  auVar84._8_4_ = auVar19._8_4_ * 3.0;
  auVar84._12_4_ = auVar19._12_4_ * 3.0;
  auVar316._8_8_ = auVar157._0_8_;
  auVar316._0_8_ = auVar157._0_8_;
  auVar19 = vshufpd_avx(auVar157,auVar157,3);
  auVar157 = vshufps_avx(auVar284,auVar284,0x55);
  auVar282 = vsubps_avx(auVar19,auVar316);
  auVar69 = vfmadd231ps_fma(auVar316,auVar157,auVar282);
  auVar322._8_8_ = auVar84._0_8_;
  auVar322._0_8_ = auVar84._0_8_;
  auVar19 = vshufpd_avx(auVar84,auVar84,3);
  auVar19 = vsubps_avx(auVar19,auVar322);
  auVar101 = vfmadd213ps_fma(auVar19,auVar157,auVar322);
  auVar157 = vmovshdup_avx(auVar101);
  auVar323._0_8_ = auVar157._0_8_ ^ 0x8000000080000000;
  auVar323._8_4_ = auVar157._8_4_ ^ 0x80000000;
  auVar323._12_4_ = auVar157._12_4_ ^ 0x80000000;
  auVar21 = vmovshdup_avx(auVar282);
  auVar19 = vunpcklps_avx(auVar21,auVar323);
  auVar17 = vshufps_avx(auVar19,auVar323,4);
  auVar266 = vshufps_avx(auVar284,auVar284,0x54);
  auVar159._0_8_ = auVar282._0_8_ ^ 0x8000000080000000;
  auVar159._8_4_ = auVar282._8_4_ ^ 0x80000000;
  auVar159._12_4_ = auVar282._12_4_ ^ 0x80000000;
  auVar19 = vmovlhps_avx(auVar159,auVar101);
  auVar19 = vshufps_avx(auVar19,auVar101,8);
  auVar157 = vfmsub231ss_fma(ZEXT416((uint)(auVar282._0_4_ * auVar157._0_4_)),auVar21,auVar101);
  uVar64 = auVar157._0_4_;
  auVar85._4_4_ = uVar64;
  auVar85._0_4_ = uVar64;
  auVar85._8_4_ = uVar64;
  auVar85._12_4_ = uVar64;
  auVar157 = vdivps_avx(auVar17,auVar85);
  auVar21 = vdivps_avx(auVar19,auVar85);
  fVar90 = auVar69._0_4_;
  fVar142 = auVar157._0_4_;
  auVar19 = vshufps_avx(auVar69,auVar69,0x55);
  fVar141 = auVar21._0_4_;
  auVar86._0_4_ = fVar90 * fVar142 + auVar19._0_4_ * fVar141;
  auVar86._4_4_ = fVar90 * auVar157._4_4_ + auVar19._4_4_ * auVar21._4_4_;
  auVar86._8_4_ = fVar90 * auVar157._8_4_ + auVar19._8_4_ * auVar21._8_4_;
  auVar86._12_4_ = fVar90 * auVar157._12_4_ + auVar19._12_4_ * auVar21._12_4_;
  auVar95 = vsubps_avx(auVar266,auVar86);
  auVar266 = vmovshdup_avx(auVar157);
  auVar19 = vinsertps_avx(auVar269,auVar308,0x1c);
  auVar190._0_4_ = auVar266._0_4_ * auVar19._0_4_;
  auVar190._4_4_ = auVar266._4_4_ * auVar19._4_4_;
  auVar190._8_4_ = auVar266._8_4_ * auVar19._8_4_;
  auVar190._12_4_ = auVar266._12_4_ * auVar19._12_4_;
  auVar17 = vinsertps_avx(auVar250,auVar294,0x1c);
  auVar112._0_4_ = auVar17._0_4_ * auVar266._0_4_;
  auVar112._4_4_ = auVar17._4_4_ * auVar266._4_4_;
  auVar112._8_4_ = auVar17._8_4_ * auVar266._8_4_;
  auVar112._12_4_ = auVar17._12_4_ * auVar266._12_4_;
  auVar69 = vminps_avx(auVar190,auVar112);
  auVar101 = vmaxps_avx(auVar112,auVar190);
  auVar266 = vinsertps_avx(auVar308,auVar269,0x4c);
  auVar154 = vmovshdup_avx(auVar21);
  auVar282 = vinsertps_avx(auVar294,auVar250,0x4c);
  auVar295._0_4_ = auVar154._0_4_ * auVar266._0_4_;
  auVar295._4_4_ = auVar154._4_4_ * auVar266._4_4_;
  auVar295._8_4_ = auVar154._8_4_ * auVar266._8_4_;
  auVar295._12_4_ = auVar154._12_4_ * auVar266._12_4_;
  auVar270._0_4_ = auVar154._0_4_ * auVar282._0_4_;
  auVar270._4_4_ = auVar154._4_4_ * auVar282._4_4_;
  auVar270._8_4_ = auVar154._8_4_ * auVar282._8_4_;
  auVar270._12_4_ = auVar154._12_4_ * auVar282._12_4_;
  auVar154 = vminps_avx(auVar295,auVar270);
  auVar309._0_4_ = auVar69._0_4_ + auVar154._0_4_;
  auVar309._4_4_ = auVar69._4_4_ + auVar154._4_4_;
  auVar309._8_4_ = auVar69._8_4_ + auVar154._8_4_;
  auVar309._12_4_ = auVar69._12_4_ + auVar154._12_4_;
  auVar69 = vmaxps_avx(auVar270,auVar295);
  auVar113._0_4_ = auVar69._0_4_ + auVar101._0_4_;
  auVar113._4_4_ = auVar69._4_4_ + auVar101._4_4_;
  auVar113._8_4_ = auVar69._8_4_ + auVar101._8_4_;
  auVar113._12_4_ = auVar69._12_4_ + auVar101._12_4_;
  auVar271._8_8_ = 0x3f80000000000000;
  auVar271._0_8_ = 0x3f80000000000000;
  auVar101 = vsubps_avx(auVar271,auVar113);
  auVar69 = vsubps_avx(auVar271,auVar309);
  auVar154 = vsubps_avx(auVar293,auVar284);
  auVar94 = vsubps_avx(auVar168,auVar284);
  auVar133._0_4_ = fVar142 * auVar19._0_4_;
  auVar133._4_4_ = fVar142 * auVar19._4_4_;
  auVar133._8_4_ = fVar142 * auVar19._8_4_;
  auVar133._12_4_ = fVar142 * auVar19._12_4_;
  auVar310._0_4_ = fVar142 * auVar17._0_4_;
  auVar310._4_4_ = fVar142 * auVar17._4_4_;
  auVar310._8_4_ = fVar142 * auVar17._8_4_;
  auVar310._12_4_ = fVar142 * auVar17._12_4_;
  auVar17 = vminps_avx(auVar133,auVar310);
  auVar19 = vmaxps_avx(auVar310,auVar133);
  auVar191._0_4_ = fVar141 * auVar266._0_4_;
  auVar191._4_4_ = fVar141 * auVar266._4_4_;
  auVar191._8_4_ = fVar141 * auVar266._8_4_;
  auVar191._12_4_ = fVar141 * auVar266._12_4_;
  auVar251._0_4_ = fVar141 * auVar282._0_4_;
  auVar251._4_4_ = fVar141 * auVar282._4_4_;
  auVar251._8_4_ = fVar141 * auVar282._8_4_;
  auVar251._12_4_ = fVar141 * auVar282._12_4_;
  auVar266 = vminps_avx(auVar191,auVar251);
  auVar311._0_4_ = auVar17._0_4_ + auVar266._0_4_;
  auVar311._4_4_ = auVar17._4_4_ + auVar266._4_4_;
  auVar311._8_4_ = auVar17._8_4_ + auVar266._8_4_;
  auVar311._12_4_ = auVar17._12_4_ + auVar266._12_4_;
  fVar164 = auVar154._0_4_;
  auVar317._0_4_ = fVar164 * auVar101._0_4_;
  fVar165 = auVar154._4_4_;
  auVar317._4_4_ = fVar165 * auVar101._4_4_;
  fVar228 = auVar154._8_4_;
  auVar317._8_4_ = fVar228 * auVar101._8_4_;
  fVar230 = auVar154._12_4_;
  auVar317._12_4_ = fVar230 * auVar101._12_4_;
  auVar17 = vmaxps_avx(auVar251,auVar191);
  auVar252._0_4_ = fVar164 * auVar69._0_4_;
  auVar252._4_4_ = fVar165 * auVar69._4_4_;
  auVar252._8_4_ = fVar228 * auVar69._8_4_;
  auVar252._12_4_ = fVar230 * auVar69._12_4_;
  fVar90 = auVar94._0_4_;
  auVar114._0_4_ = fVar90 * auVar101._0_4_;
  fVar140 = auVar94._4_4_;
  auVar114._4_4_ = fVar140 * auVar101._4_4_;
  fVar139 = auVar94._8_4_;
  auVar114._8_4_ = fVar139 * auVar101._8_4_;
  fVar163 = auVar94._12_4_;
  auVar114._12_4_ = fVar163 * auVar101._12_4_;
  auVar272._0_4_ = fVar90 * auVar69._0_4_;
  auVar272._4_4_ = fVar140 * auVar69._4_4_;
  auVar272._8_4_ = fVar139 * auVar69._8_4_;
  auVar272._12_4_ = fVar163 * auVar69._12_4_;
  auVar134._0_4_ = auVar19._0_4_ + auVar17._0_4_;
  auVar134._4_4_ = auVar19._4_4_ + auVar17._4_4_;
  auVar134._8_4_ = auVar19._8_4_ + auVar17._8_4_;
  auVar134._12_4_ = auVar19._12_4_ + auVar17._12_4_;
  auVar192._8_8_ = 0x3f800000;
  auVar192._0_8_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar192,auVar134);
  auVar17 = vsubps_avx(auVar192,auVar311);
  auVar312._0_4_ = fVar164 * auVar19._0_4_;
  auVar312._4_4_ = fVar165 * auVar19._4_4_;
  auVar312._8_4_ = fVar228 * auVar19._8_4_;
  auVar312._12_4_ = fVar230 * auVar19._12_4_;
  auVar296._0_4_ = fVar164 * auVar17._0_4_;
  auVar296._4_4_ = fVar165 * auVar17._4_4_;
  auVar296._8_4_ = fVar228 * auVar17._8_4_;
  auVar296._12_4_ = fVar230 * auVar17._12_4_;
  auVar135._0_4_ = fVar90 * auVar19._0_4_;
  auVar135._4_4_ = fVar140 * auVar19._4_4_;
  auVar135._8_4_ = fVar139 * auVar19._8_4_;
  auVar135._12_4_ = fVar163 * auVar19._12_4_;
  auVar193._0_4_ = fVar90 * auVar17._0_4_;
  auVar193._4_4_ = fVar140 * auVar17._4_4_;
  auVar193._8_4_ = fVar139 * auVar17._8_4_;
  auVar193._12_4_ = fVar163 * auVar17._12_4_;
  auVar19 = vminps_avx(auVar312,auVar296);
  auVar17 = vminps_avx(auVar135,auVar193);
  auVar19 = vminps_avx(auVar19,auVar17);
  auVar17 = vmaxps_avx(auVar296,auVar312);
  auVar266 = vmaxps_avx(auVar193,auVar135);
  auVar282 = vminps_avx(auVar317,auVar252);
  auVar101 = vminps_avx(auVar114,auVar272);
  auVar282 = vminps_avx(auVar282,auVar101);
  auVar19 = vhaddps_avx(auVar19,auVar282);
  auVar17 = vmaxps_avx(auVar266,auVar17);
  auVar266 = vmaxps_avx(auVar252,auVar317);
  auVar282 = vmaxps_avx(auVar272,auVar114);
  auVar266 = vmaxps_avx(auVar282,auVar266);
  auVar17 = vhaddps_avx(auVar17,auVar266);
  auVar19 = vshufps_avx(auVar19,auVar19,0xe8);
  auVar17 = vshufps_avx(auVar17,auVar17,0xe8);
  auVar273._0_4_ = auVar95._0_4_ + auVar19._0_4_;
  auVar273._4_4_ = auVar95._4_4_ + auVar19._4_4_;
  auVar273._8_4_ = auVar95._8_4_ + auVar19._8_4_;
  auVar273._12_4_ = auVar95._12_4_ + auVar19._12_4_;
  auVar253._0_4_ = auVar95._0_4_ + auVar17._0_4_;
  auVar253._4_4_ = auVar95._4_4_ + auVar17._4_4_;
  auVar253._8_4_ = auVar95._8_4_ + auVar17._8_4_;
  auVar253._12_4_ = auVar95._12_4_ + auVar17._12_4_;
  auVar256 = ZEXT1664(auVar253);
  auVar19 = vmaxps_avx(auVar293,auVar273);
  auVar17 = vminps_avx(auVar253,auVar168);
  auVar19 = vcmpps_avx(auVar17,auVar19,1);
  auVar19 = vshufps_avx(auVar19,auVar19,0x50);
  if ((auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar19[0xf] < '\0')
  goto LAB_0123879e;
  bVar60 = 0;
  if ((auVar226._0_4_ < auVar273._0_4_) && (bVar60 = 0, auVar253._0_4_ < auVar168._0_4_)) {
    auVar17 = vmovshdup_avx(auVar273);
    auVar19 = vcmpps_avx(auVar253,auVar168,1);
    bVar60 = auVar19[4] & auVar122._0_4_ < auVar17._0_4_;
  }
  auVar256 = ZEXT464(0x40400000);
  if (((3 < (uint)uVar58 || fVar68 < 0.001) | bVar60) != 1) goto LAB_01239568;
  lVar67 = 0xc9;
  do {
    lVar67 = lVar67 + -1;
    if (lVar67 == 0) goto LAB_0123879e;
    fVar140 = auVar95._0_4_;
    fVar90 = 1.0 - fVar140;
    fVar68 = fVar90 * fVar90 * fVar90;
    fVar91 = fVar140 * 3.0 * fVar90 * fVar90;
    fVar90 = fVar90 * fVar140 * fVar140 * 3.0;
    auVar179._4_4_ = fVar68;
    auVar179._0_4_ = fVar68;
    auVar179._8_4_ = fVar68;
    auVar179._12_4_ = fVar68;
    auVar136._4_4_ = fVar91;
    auVar136._0_4_ = fVar91;
    auVar136._8_4_ = fVar91;
    auVar136._12_4_ = fVar91;
    auVar115._4_4_ = fVar90;
    auVar115._0_4_ = fVar90;
    auVar115._8_4_ = fVar90;
    auVar115._12_4_ = fVar90;
    fVar140 = fVar140 * fVar140 * fVar140;
    auVar194._0_4_ = (float)local_1f8._0_4_ * fVar140;
    auVar194._4_4_ = (float)local_1f8._4_4_ * fVar140;
    auVar194._8_4_ = fStack_1f0 * fVar140;
    auVar194._12_4_ = fStack_1ec * fVar140;
    auVar18 = vfmadd231ps_fma(auVar194,auVar171,auVar115);
    auVar18 = vfmadd231ps_fma(auVar18,auVar20,auVar136);
    auVar18 = vfmadd231ps_fma(auVar18,local_4e8,auVar179);
    auVar116._8_8_ = auVar18._0_8_;
    auVar116._0_8_ = auVar18._0_8_;
    auVar18 = vshufpd_avx(auVar18,auVar18,3);
    auVar19 = vshufps_avx(auVar95,auVar95,0x55);
    auVar18 = vsubps_avx(auVar18,auVar116);
    auVar19 = vfmadd213ps_fma(auVar18,auVar19,auVar116);
    fVar68 = auVar19._0_4_;
    auVar18 = vshufps_avx(auVar19,auVar19,0x55);
    auVar117._0_4_ = fVar142 * fVar68 + fVar141 * auVar18._0_4_;
    auVar117._4_4_ = auVar157._4_4_ * fVar68 + auVar21._4_4_ * auVar18._4_4_;
    auVar117._8_4_ = auVar157._8_4_ * fVar68 + auVar21._8_4_ * auVar18._8_4_;
    auVar117._12_4_ = auVar157._12_4_ * fVar68 + auVar21._12_4_ * auVar18._12_4_;
    auVar95 = vsubps_avx(auVar95,auVar117);
    auVar18 = vandps_avx(local_2b8,auVar19);
    auVar19 = vshufps_avx(auVar18,auVar18,0xf5);
    auVar18 = vmaxss_avx(auVar19,auVar18);
  } while ((float)local_208._0_4_ <= auVar18._0_4_);
  fVar68 = auVar95._0_4_;
  if ((fVar68 < 0.0) || (1.0 < fVar68)) goto LAB_0123879e;
  auVar18 = vmovshdup_avx(auVar95);
  fVar91 = auVar18._0_4_;
  if ((fVar91 < 0.0) || (1.0 < fVar91)) goto LAB_0123879e;
  auVar18 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar266 = vinsertps_avx(auVar18,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar6 = (ray->org).field_0;
  auVar18 = vsubps_avx(local_338,(undefined1  [16])aVar6);
  auVar18 = vdpps_avx(auVar18,auVar266,0x7f);
  auVar19 = vsubps_avx(local_348,(undefined1  [16])aVar6);
  auVar19 = vdpps_avx(auVar19,auVar266,0x7f);
  auVar157 = vsubps_avx(local_358,(undefined1  [16])aVar6);
  auVar157 = vdpps_avx(auVar157,auVar266,0x7f);
  auVar21 = vsubps_avx(local_368,(undefined1  [16])aVar6);
  auVar21 = vdpps_avx(auVar21,auVar266,0x7f);
  auVar17 = vsubps_avx(_local_378,(undefined1  [16])aVar6);
  auVar17 = vdpps_avx(auVar17,auVar266,0x7f);
  auVar293 = vsubps_avx(_local_3d8,(undefined1  [16])aVar6);
  auVar293 = vdpps_avx(auVar293,auVar266,0x7f);
  auVar168 = vsubps_avx(_local_388,(undefined1  [16])aVar6);
  auVar168 = vdpps_avx(auVar168,auVar266,0x7f);
  auVar282 = vsubps_avx(_local_3e8,(undefined1  [16])aVar6);
  auVar266 = vdpps_avx(auVar282,auVar266,0x7f);
  fVar142 = 1.0 - fVar91;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ * fVar91)),ZEXT416((uint)fVar142),auVar18);
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar293._0_4_ * fVar91)),ZEXT416((uint)fVar142),auVar19)
  ;
  auVar157 = vfmadd231ss_fma(ZEXT416((uint)(auVar168._0_4_ * fVar91)),ZEXT416((uint)fVar142),
                             auVar157);
  auVar256 = ZEXT1664(auVar157);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar91 * auVar266._0_4_)),ZEXT416((uint)fVar142),auVar21)
  ;
  fVar90 = 1.0 - fVar68;
  fVar91 = fVar90 * fVar68 * fVar68 * 3.0;
  fVar139 = fVar68 * fVar68 * fVar68;
  auVar157 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * fVar139)),ZEXT416((uint)fVar91),auVar157
                            );
  fVar142 = fVar68 * 3.0 * fVar90 * fVar90;
  auVar19 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar142),auVar19);
  fVar141 = fVar90 * fVar90 * fVar90;
  auVar18 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar141),auVar18);
  fVar140 = auVar18._0_4_;
  if ((fVar140 < (ray->org).field_0.m128[3]) || (fVar163 = ray->tfar, fVar163 < fVar140))
  goto LAB_0123879e;
  pGVar9 = (context->scene->geometries).items[local_430].ptr;
  if ((pGVar9->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar60 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01239510;
    auVar18 = vshufps_avx(auVar95,auVar95,0x55);
    auVar239._8_4_ = 0x3f800000;
    auVar239._0_8_ = 0x3f8000003f800000;
    auVar239._12_4_ = 0x3f800000;
    auVar19 = vsubps_avx(auVar239,auVar18);
    fVar164 = auVar18._0_4_;
    auVar254._0_4_ = fVar164 * (float)local_378._0_4_;
    fVar165 = auVar18._4_4_;
    auVar254._4_4_ = fVar165 * (float)local_378._4_4_;
    fVar228 = auVar18._8_4_;
    auVar254._8_4_ = fVar228 * fStack_370;
    fVar230 = auVar18._12_4_;
    auVar254._12_4_ = fVar230 * fStack_36c;
    auVar274._0_4_ = fVar164 * (float)local_3d8._0_4_;
    auVar274._4_4_ = fVar165 * (float)local_3d8._4_4_;
    auVar274._8_4_ = fVar228 * fStack_3d0;
    auVar274._12_4_ = fVar230 * fStack_3cc;
    auVar285._0_4_ = fVar164 * (float)local_388._0_4_;
    auVar285._4_4_ = fVar165 * (float)local_388._4_4_;
    auVar285._8_4_ = fVar228 * fStack_380;
    auVar285._12_4_ = fVar230 * fStack_37c;
    auVar221._0_4_ = fVar164 * (float)local_3e8._0_4_;
    auVar221._4_4_ = fVar165 * (float)local_3e8._4_4_;
    auVar221._8_4_ = fVar228 * fStack_3e0;
    auVar221._12_4_ = fVar230 * fStack_3dc;
    auVar18 = vfmadd231ps_fma(auVar254,auVar19,local_338);
    auVar157 = vfmadd231ps_fma(auVar274,auVar19,local_348);
    auVar21 = vfmadd231ps_fma(auVar285,auVar19,local_358);
    auVar17 = vfmadd231ps_fma(auVar221,auVar19,local_368);
    auVar18 = vsubps_avx(auVar157,auVar18);
    auVar19 = vsubps_avx(auVar21,auVar157);
    auVar256 = ZEXT1664(auVar19);
    auVar157 = vsubps_avx(auVar17,auVar21);
    auVar286._0_4_ = fVar68 * auVar19._0_4_;
    auVar286._4_4_ = fVar68 * auVar19._4_4_;
    auVar286._8_4_ = fVar68 * auVar19._8_4_;
    auVar286._12_4_ = fVar68 * auVar19._12_4_;
    auVar210._4_4_ = fVar90;
    auVar210._0_4_ = fVar90;
    auVar210._8_4_ = fVar90;
    auVar210._12_4_ = fVar90;
    auVar18 = vfmadd231ps_fma(auVar286,auVar210,auVar18);
    auVar222._0_4_ = fVar68 * auVar157._0_4_;
    auVar222._4_4_ = fVar68 * auVar157._4_4_;
    auVar222._8_4_ = fVar68 * auVar157._8_4_;
    auVar222._12_4_ = fVar68 * auVar157._12_4_;
    auVar157 = vfmadd231ps_fma(auVar222,auVar210,auVar19);
    auVar223._0_4_ = fVar68 * auVar157._0_4_;
    auVar223._4_4_ = fVar68 * auVar157._4_4_;
    auVar223._8_4_ = fVar68 * auVar157._8_4_;
    auVar223._12_4_ = fVar68 * auVar157._12_4_;
    auVar157 = vfmadd231ps_fma(auVar223,auVar210,auVar18);
    auVar195._0_4_ = fVar139 * (float)local_268._0_4_;
    auVar195._4_4_ = fVar139 * (float)local_268._4_4_;
    auVar195._8_4_ = fVar139 * fStack_260;
    auVar195._12_4_ = fVar139 * fStack_25c;
    auVar137._4_4_ = fVar91;
    auVar137._0_4_ = fVar91;
    auVar137._8_4_ = fVar91;
    auVar137._12_4_ = fVar91;
    auVar18 = vfmadd132ps_fma(auVar137,auVar195,local_258);
    auVar180._4_4_ = fVar142;
    auVar180._0_4_ = fVar142;
    auVar180._8_4_ = fVar142;
    auVar180._12_4_ = fVar142;
    auVar18 = vfmadd132ps_fma(auVar180,auVar18,local_248);
    auVar138._0_4_ = auVar157._0_4_ * 3.0;
    auVar138._4_4_ = auVar157._4_4_ * 3.0;
    auVar138._8_4_ = auVar157._8_4_ * 3.0;
    auVar138._12_4_ = auVar157._12_4_ * 3.0;
    auVar160._4_4_ = fVar141;
    auVar160._0_4_ = fVar141;
    auVar160._8_4_ = fVar141;
    auVar160._12_4_ = fVar141;
    auVar157 = vfmadd132ps_fma(auVar160,auVar18,local_238);
    auVar18 = vshufps_avx(auVar138,auVar138,0xc9);
    auVar181._0_4_ = auVar157._0_4_ * auVar18._0_4_;
    auVar181._4_4_ = auVar157._4_4_ * auVar18._4_4_;
    auVar181._8_4_ = auVar157._8_4_ * auVar18._8_4_;
    auVar181._12_4_ = auVar157._12_4_ * auVar18._12_4_;
    auVar18 = vshufps_avx(auVar157,auVar157,0xc9);
    auVar157 = vfmsub231ps_fma(auVar181,auVar138,auVar18);
    auVar18 = vshufps_avx(auVar157,auVar157,0xe9);
    local_298 = vmovlps_avx(auVar18);
    local_290 = auVar157._0_4_;
    local_28c = vmovlps_avx(auVar95);
    local_284 = (int)local_308;
    local_280 = (int)local_430;
    local_27c = context->user->instID[0];
    local_278 = context->user->instPrimID[0];
    ray->tfar = fVar140;
    local_4ec = -1;
    local_2f8.valid = &local_4ec;
    local_2f8.geometryUserPtr = pGVar9->userPtr;
    local_2f8.context = context->user;
    local_2f8.hit = (RTCHitN *)&local_298;
    local_2f8.N = 1;
    local_2f8.ray = (RTCRayN *)ray;
    if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012394be:
      p_Var15 = context->args->filter;
      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
        auVar256 = ZEXT1664(auVar256._0_16_);
        (*p_Var15)(&local_2f8);
        if (*local_2f8.valid == 0) goto LAB_01239502;
      }
      bVar60 = 1;
      goto LAB_01239510;
    }
    auVar256 = ZEXT1664(auVar19);
    (*pGVar9->occlusionFilterN)(&local_2f8);
    if (*local_2f8.valid != 0) goto LAB_012394be;
LAB_01239502:
    ray->tfar = fVar163;
  }
  bVar60 = 0;
LAB_01239510:
  bVar66 = (bool)(bVar66 | bVar60);
  goto LAB_0123879e;
LAB_01239568:
  local_218 = vinsertps_avx(auVar18,ZEXT416((uint)fVar91),0x10);
  auVar75 = vinsertps_avx(auVar122,ZEXT416((uint)auVar123._0_4_),0x10);
  goto LAB_012381ed;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }